

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution1D_x86_avx::forward
          (Convolution1D_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 uVar7;
  void *pvVar8;
  size_t sVar9;
  size_t sVar10;
  void *pvVar11;
  size_t sVar12;
  void *pvVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  int *piVar17;
  undefined1 auVar18 [16];
  void *pvVar19;
  char cVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  float *pfVar32;
  float *pfVar33;
  float *pfVar34;
  uint uVar35;
  long lVar36;
  long lVar37;
  _func_int ***ppp_Var38;
  uint uVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  void *pvVar45;
  _func_int ***ppp_Var46;
  int iVar47;
  float *pfVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  float *pfVar52;
  long lVar53;
  undefined4 *puVar54;
  int iVar55;
  undefined4 *puVar56;
  long lVar57;
  long lVar58;
  bool bVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined4 extraout_XMM0_Db_00;
  undefined1 auVar63 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar64 [32];
  undefined4 extraout_XMM0_Dd;
  undefined1 extraout_var [60];
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 extraout_var_00 [60];
  float fVar65;
  float fVar80;
  float fVar81;
  float sum [4];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar105 [28];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar114 [32];
  float fVar115;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar149 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  float fVar139;
  float fVar143;
  undefined1 auVar129 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  float fVar137;
  float fVar138;
  float fVar140;
  float fVar141;
  float fVar142;
  undefined1 in_ZMM3 [64];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar147;
  undefined1 in_ZMM4 [64];
  undefined1 auVar148 [64];
  undefined1 auVar152 [32];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar153 [64];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar164 [32];
  undefined1 auVar163 [16];
  undefined1 auVar165 [64];
  undefined1 auVar166 [32];
  undefined1 auVar167 [64];
  float fVar168;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  undefined1 auVar169 [32];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  int elempack;
  ulong local_1f0;
  void *local_1d8;
  Allocator *local_1d0;
  undefined1 (*local_1c0) [32];
  ulong local_1b8;
  undefined1 local_198 [16];
  uint local_188;
  undefined1 (*local_178) [16];
  ulong local_170;
  ulong local_160;
  long local_148;
  long local_140;
  undefined1 local_108 [16];
  uint local_f0;
  Mat local_c8;
  ulong local_80;
  ulong local_78;
  long local_70;
  ulong local_68;
  ulong local_60;
  long local_58;
  long local_50;
  long local_48;
  void *local_40;
  void *local_38;
  undefined1 auVar113 [32];
  undefined1 auVar130 [32];
  undefined1 auVar134 [32];
  
  uVar30 = bottom_blob->elemsize;
  iVar4 = (this->super_Convolution1D).kernel_w;
  iVar5 = (this->super_Convolution1D).dilation_w;
  iVar6 = bottom_blob->elempack;
  local_c8.cstep = 0;
  local_c8.data = (Allocator *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_c8.elempack = 0;
  local_c8.h = 0;
  local_c8.allocator = (Allocator *)local_c8.data;
  local_c8.dims = (int)local_c8.refcount;
  local_c8.w = local_c8.refcount._4_4_;
  local_c8.d = (int)local_c8.refcount;
  local_c8.c = local_c8.elempack;
  Convolution1D::make_padding(&this->super_Convolution1D,bottom_blob,&local_c8,opt);
  iVar47 = -100;
  if (((Allocator *)local_c8.data != (Allocator *)0x0) && ((long)local_c8.c * local_c8.cstep != 0))
  {
    uVar35 = (this->super_Convolution1D).num_output;
    lVar26 = 1;
    if (opt->use_packing_layout == true) {
      lVar26 = 8;
      if ((uVar35 & 7) != 0) {
        lVar26 = (ulong)((uVar35 & 3) == 0) * 3 + 1;
      }
    }
    Mat::create(top_blob,(local_c8.w + ~((iVar4 + -1) * iVar5)) /
                         (this->super_Convolution1D).stride_w + 1,(int)uVar35 / (int)lVar26,
                lVar26 * (uVar30 / (ulong)(long)iVar6),(int)lVar26,opt->blob_allocator);
    iVar4 = local_c8.elempack;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      iVar5 = (this->super_Convolution1D).kernel_w;
      uVar35 = (this->super_Convolution1D).activation_type;
      local_78 = (ulong)uVar35;
      iVar6 = (this->super_Convolution1D).dilation_w;
      lVar26 = (long)iVar6;
      iVar47 = (this->super_Convolution1D).stride_w;
      lVar27 = (long)iVar47;
      uVar21 = local_c8.h * local_c8.elempack;
      iVar22 = local_c8.w * local_c8.elempack;
      local_58 = (long)top_blob->w;
      local_80 = (long)top_blob->h * (long)top_blob->elempack;
      lVar53 = top_blob->elempack * local_58;
      iVar25 = (int)local_80;
      iVar55 = iVar25 + 7;
      if (-1 < iVar25) {
        iVar55 = iVar25;
      }
      pvVar8 = (this->super_Convolution1D).bias_data.data;
      uVar39 = iVar55 >> 3;
      lVar58 = (long)iVar22;
      iVar55 = (int)lVar53;
      if (7 < iVar25) {
        auVar167 = ZEXT3264(CONCAT428(0x3f000000,
                                      CONCAT424(0x3f000000,
                                                CONCAT420(0x3f000000,
                                                          CONCAT416(0x3f000000,
                                                                    CONCAT412(0x3f000000,
                                                                              CONCAT48(0x3f000000,
                                                                                                                                                                              
                                                  0x3f0000003f000000)))))));
        auVar148 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar165 = ZEXT1664(ZEXT816(0) << 0x40);
        local_70 = lVar58 * 4;
        local_1f0 = 0;
        do {
          lVar28 = (long)top_blob->w;
          if (0 < lVar28) {
            uVar49 = local_c8.h * local_c8.elempack;
            iVar44 = top_blob->elempack;
            local_1c0 = (undefined1 (*) [32])
                        ((int)((long)((ulong)(uint)((int)(local_1f0 * 8) >> 0x1f) << 0x20 |
                                     local_1f0 * 8 & 0xffffffff) / (long)iVar44) * lVar28 *
                         top_blob->elemsize + (long)top_blob->data);
            auVar117._8_8_ = 0;
            auVar117._0_8_ = local_108._8_8_;
            local_108 = auVar117 << 0x40;
            iVar42 = 0;
            auVar149._8_8_ = 0;
            auVar149._0_8_ = local_198._8_8_;
            local_198 = auVar149 << 0x40;
            local_140 = local_70;
            do {
              auVar153 = ZEXT1664(ZEXT816(0) << 0x40);
              fVar171 = 0.0;
              fVar172 = 0.0;
              fVar168 = 0.0;
              fVar170 = 0.0;
              fVar173 = 0.0;
              fVar174 = 0.0;
              fVar175 = 0.0;
              fVar176 = 0.0;
              if (pvVar8 != (void *)0x0) {
                pfVar48 = (float *)((long)pvVar8 + local_1f0 * 0x20);
                fVar168 = *pfVar48;
                fVar170 = pfVar48[1];
                fVar171 = pfVar48[2];
                fVar172 = pfVar48[3];
                fVar173 = pfVar48[4];
                fVar174 = pfVar48[5];
                fVar175 = pfVar48[6];
                fVar176 = pfVar48[7];
              }
              pfVar48 = (float *)((this->weight_data_tm).cstep * local_1f0 *
                                  (this->weight_data_tm).elemsize +
                                 (long)(this->weight_data_tm).data);
              if ((int)uVar49 < 8) {
                fVar65 = 0.0;
                fVar80 = 0.0;
                fVar81 = 0.0;
                fVar82 = 0.0;
                fVar83 = 0.0;
                fVar84 = 0.0;
                fVar85 = 0.0;
                fVar86 = 0.0;
                fVar179 = 0.0;
                fVar180 = 0.0;
                fVar181 = 0.0;
                fVar182 = 0.0;
                fVar183 = 0.0;
                fVar184 = 0.0;
                fVar185 = 0.0;
                fVar186 = 0.0;
                uVar23 = 0;
              }
              else {
                fVar179 = 0.0;
                fVar180 = 0.0;
                fVar181 = 0.0;
                fVar182 = 0.0;
                fVar183 = 0.0;
                fVar184 = 0.0;
                fVar185 = 0.0;
                fVar186 = 0.0;
                fVar65 = 0.0;
                fVar80 = 0.0;
                fVar81 = 0.0;
                fVar82 = 0.0;
                fVar83 = 0.0;
                fVar84 = 0.0;
                fVar85 = 0.0;
                fVar86 = 0.0;
                iVar41 = 0;
                do {
                  lVar29 = (long)(iVar41 / local_c8.elempack) * (long)local_c8.w * local_c8.elemsize
                  ;
                  if (local_c8.elempack == 8) {
                    if (0 < iVar5) {
                      pfVar52 = (float *)((long)(_func_int ***)local_c8.data +
                                         lVar29 + (long)iVar42 * 4);
                      iVar40 = iVar5;
                      do {
                        fVar147 = *pfVar52;
                        fVar1 = pfVar52[1];
                        fVar2 = pfVar52[2];
                        fVar143 = pfVar52[3];
                        fVar3 = pfVar52[4];
                        fVar115 = fVar143 * pfVar48[0x18] + auVar153._0_4_;
                        fVar137 = fVar143 * pfVar48[0x19] + auVar153._4_4_;
                        fVar138 = fVar143 * pfVar48[0x1a] + auVar153._8_4_;
                        fVar139 = fVar143 * pfVar48[0x1b] + auVar153._12_4_;
                        fVar140 = fVar143 * pfVar48[0x1c] + auVar153._16_4_;
                        fVar141 = fVar143 * pfVar48[0x1d] + auVar153._20_4_;
                        fVar142 = fVar143 * pfVar48[0x1e] + auVar153._24_4_;
                        fVar143 = fVar143 + auVar153._28_4_;
                        in_ZMM3 = ZEXT3264(CONCAT428(fVar143,CONCAT424(fVar142,CONCAT420(fVar141,
                                                  CONCAT416(fVar140,CONCAT412(fVar139,CONCAT48(
                                                  fVar138,CONCAT44(fVar137,fVar115))))))));
                        fVar168 = fVar3 * pfVar48[0x20] + fVar168 + fVar147 * *pfVar48;
                        fVar170 = fVar3 * pfVar48[0x21] + fVar170 + fVar147 * pfVar48[1];
                        fVar171 = fVar3 * pfVar48[0x22] + fVar171 + fVar147 * pfVar48[2];
                        fVar172 = fVar3 * pfVar48[0x23] + fVar172 + fVar147 * pfVar48[3];
                        fVar173 = fVar3 * pfVar48[0x24] + fVar173 + fVar147 * pfVar48[4];
                        fVar174 = fVar3 * pfVar48[0x25] + fVar174 + fVar147 * pfVar48[5];
                        fVar175 = fVar3 * pfVar48[0x26] + fVar175 + fVar147 * pfVar48[6];
                        fVar176 = fVar3 + fVar176 + fVar147;
                        fVar147 = pfVar52[5];
                        fVar3 = pfVar52[6];
                        fVar179 = fVar1 * pfVar48[8] + fVar179 + fVar147 * pfVar48[0x28];
                        fVar180 = fVar1 * pfVar48[9] + fVar180 + fVar147 * pfVar48[0x29];
                        fVar181 = fVar1 * pfVar48[10] + fVar181 + fVar147 * pfVar48[0x2a];
                        fVar182 = fVar1 * pfVar48[0xb] + fVar182 + fVar147 * pfVar48[0x2b];
                        fVar183 = fVar1 * pfVar48[0xc] + fVar183 + fVar147 * pfVar48[0x2c];
                        fVar184 = fVar1 * pfVar48[0xd] + fVar184 + fVar147 * pfVar48[0x2d];
                        fVar185 = fVar1 * pfVar48[0xe] + fVar185 + fVar147 * pfVar48[0x2e];
                        fVar186 = fVar1 + fVar186 + fVar147;
                        fVar65 = fVar2 * pfVar48[0x10] + fVar65 + fVar3 * pfVar48[0x30];
                        fVar80 = fVar2 * pfVar48[0x11] + fVar80 + fVar3 * pfVar48[0x31];
                        fVar81 = fVar2 * pfVar48[0x12] + fVar81 + fVar3 * pfVar48[0x32];
                        fVar82 = fVar2 * pfVar48[0x13] + fVar82 + fVar3 * pfVar48[0x33];
                        fVar83 = fVar2 * pfVar48[0x14] + fVar83 + fVar3 * pfVar48[0x34];
                        fVar84 = fVar2 * pfVar48[0x15] + fVar84 + fVar3 * pfVar48[0x35];
                        fVar85 = fVar2 * pfVar48[0x16] + fVar85 + fVar3 * pfVar48[0x36];
                        fVar86 = fVar2 + fVar86 + fVar147;
                        fVar147 = pfVar52[7];
                        auVar153 = ZEXT3264(CONCAT428(fVar143 + fVar147,
                                                      CONCAT424(fVar142 + fVar147 * pfVar48[0x3e],
                                                                CONCAT420(fVar141 + fVar147 * 
                                                  pfVar48[0x3d],
                                                  CONCAT416(fVar140 + fVar147 * pfVar48[0x3c],
                                                            CONCAT412(fVar139 + fVar147 * pfVar48[
                                                  0x3b],CONCAT48(fVar138 + fVar147 * pfVar48[0x3a],
                                                                 CONCAT44(fVar137 + fVar147 * 
                                                  pfVar48[0x39],fVar115 + fVar147 * pfVar48[0x38])))
                                                  )))));
                        pfVar48 = pfVar48 + 0x40;
                        pfVar52 = pfVar52 + iVar6 * 8;
                        iVar40 = iVar40 + -1;
                      } while (iVar40 != 0);
                      goto LAB_0053c89e;
                    }
                  }
                  else {
                    pfVar52 = (float *)((long)(_func_int ***)local_c8.data +
                                       lVar29 + (long)(iVar47 * local_c8.elempack * local_198._0_4_)
                                                * 4);
LAB_0053c89e:
                    if (local_c8.elempack == 4) {
                      iVar40 = iVar5;
                      if (iVar5 < 1) goto LAB_0053c9ff;
                      do {
                        fVar147 = *pfVar52;
                        fVar1 = pfVar52[1];
                        fVar2 = pfVar52[2];
                        fVar179 = fVar179 + fVar1 * pfVar48[8];
                        fVar180 = fVar180 + fVar1 * pfVar48[9];
                        fVar181 = fVar181 + fVar1 * pfVar48[10];
                        fVar182 = fVar182 + fVar1 * pfVar48[0xb];
                        fVar183 = fVar183 + fVar1 * pfVar48[0xc];
                        fVar184 = fVar184 + fVar1 * pfVar48[0xd];
                        fVar185 = fVar185 + fVar1 * pfVar48[0xe];
                        in_ZMM3 = ZEXT3264(CONCAT428(fVar186 + fVar1,
                                                     CONCAT424(fVar185,CONCAT420(fVar184,CONCAT416(
                                                  fVar183,CONCAT412(fVar182,CONCAT48(fVar181,
                                                  CONCAT44(fVar180,fVar179))))))));
                        fVar143 = pfVar52[3];
                        fVar3 = pfVar52[lVar58];
                        fVar168 = fVar3 * pfVar48[0x20] + fVar168 + fVar147 * *pfVar48;
                        fVar170 = fVar3 * pfVar48[0x21] + fVar170 + fVar147 * pfVar48[1];
                        fVar171 = fVar3 * pfVar48[0x22] + fVar171 + fVar147 * pfVar48[2];
                        fVar172 = fVar3 * pfVar48[0x23] + fVar172 + fVar147 * pfVar48[3];
                        fVar173 = fVar3 * pfVar48[0x24] + fVar173 + fVar147 * pfVar48[4];
                        fVar174 = fVar3 * pfVar48[0x25] + fVar174 + fVar147 * pfVar48[5];
                        fVar175 = fVar3 * pfVar48[0x26] + fVar175 + fVar147 * pfVar48[6];
                        fVar176 = fVar3 + fVar176 + fVar147;
                        fVar147 = pfVar52[lVar58 + 1];
                        fVar3 = pfVar52[lVar58 + 2];
                        fVar179 = fVar179 + fVar147 * pfVar48[0x28];
                        fVar180 = fVar180 + fVar147 * pfVar48[0x29];
                        fVar181 = fVar181 + fVar147 * pfVar48[0x2a];
                        fVar182 = fVar182 + fVar147 * pfVar48[0x2b];
                        fVar183 = fVar183 + fVar147 * pfVar48[0x2c];
                        fVar184 = fVar184 + fVar147 * pfVar48[0x2d];
                        fVar185 = fVar185 + fVar147 * pfVar48[0x2e];
                        fVar186 = fVar186 + fVar1 + fVar147;
                        fVar65 = fVar2 * pfVar48[0x10] + fVar65 + fVar3 * pfVar48[0x30];
                        fVar80 = fVar2 * pfVar48[0x11] + fVar80 + fVar3 * pfVar48[0x31];
                        fVar81 = fVar2 * pfVar48[0x12] + fVar81 + fVar3 * pfVar48[0x32];
                        fVar82 = fVar2 * pfVar48[0x13] + fVar82 + fVar3 * pfVar48[0x33];
                        fVar83 = fVar2 * pfVar48[0x14] + fVar83 + fVar3 * pfVar48[0x34];
                        fVar84 = fVar2 * pfVar48[0x15] + fVar84 + fVar3 * pfVar48[0x35];
                        fVar85 = fVar2 * pfVar48[0x16] + fVar85 + fVar3 * pfVar48[0x36];
                        fVar86 = fVar2 + fVar86 + fVar147;
                        fVar147 = pfVar52[lVar58 + 3];
                        auVar153 = ZEXT3264(CONCAT428(fVar143 + auVar153._28_4_ + fVar147,
                                                      CONCAT424(fVar143 * pfVar48[0x1e] +
                                                                auVar153._24_4_ +
                                                                fVar147 * pfVar48[0x3e],
                                                                CONCAT420(fVar143 * pfVar48[0x1d] +
                                                                          auVar153._20_4_ +
                                                                          fVar147 * pfVar48[0x3d],
                                                                          CONCAT416(fVar143 * 
                                                  pfVar48[0x1c] + auVar153._16_4_ +
                                                  fVar147 * pfVar48[0x3c],
                                                  CONCAT412(fVar143 * pfVar48[0x1b] +
                                                            auVar153._12_4_ +
                                                            fVar147 * pfVar48[0x3b],
                                                            CONCAT48(fVar143 * pfVar48[0x1a] +
                                                                     auVar153._8_4_ +
                                                                     fVar147 * pfVar48[0x3a],
                                                                     CONCAT44(fVar143 * pfVar48[0x19
                                                  ] + auVar153._4_4_ + fVar147 * pfVar48[0x39],
                                                  fVar143 * pfVar48[0x18] + auVar153._0_4_ +
                                                  fVar147 * pfVar48[0x38]))))))));
                        pfVar48 = pfVar48 + 0x40;
                        pfVar52 = pfVar52 + iVar6 * 4;
                        iVar40 = iVar40 + -1;
                      } while (iVar40 != 0);
                    }
                    if ((local_c8.elempack == 1) && (iVar40 = iVar5, 0 < iVar5)) {
                      do {
                        fVar147 = *pfVar52;
                        fVar1 = pfVar52[lVar58];
                        fVar2 = pfVar52[iVar22 * 2];
                        fVar179 = fVar179 + fVar1 * pfVar48[8];
                        fVar180 = fVar180 + fVar1 * pfVar48[9];
                        fVar181 = fVar181 + fVar1 * pfVar48[10];
                        fVar182 = fVar182 + fVar1 * pfVar48[0xb];
                        fVar183 = fVar183 + fVar1 * pfVar48[0xc];
                        fVar184 = fVar184 + fVar1 * pfVar48[0xd];
                        fVar185 = fVar185 + fVar1 * pfVar48[0xe];
                        in_ZMM3 = ZEXT3264(CONCAT428(fVar186 + fVar1,
                                                     CONCAT424(fVar185,CONCAT420(fVar184,CONCAT416(
                                                  fVar183,CONCAT412(fVar182,CONCAT48(fVar181,
                                                  CONCAT44(fVar180,fVar179))))))));
                        fVar143 = pfVar52[iVar22 * 3];
                        fVar3 = pfVar52[iVar22 * 4];
                        fVar168 = fVar3 * pfVar48[0x20] + fVar168 + fVar147 * *pfVar48;
                        fVar170 = fVar3 * pfVar48[0x21] + fVar170 + fVar147 * pfVar48[1];
                        fVar171 = fVar3 * pfVar48[0x22] + fVar171 + fVar147 * pfVar48[2];
                        fVar172 = fVar3 * pfVar48[0x23] + fVar172 + fVar147 * pfVar48[3];
                        fVar173 = fVar3 * pfVar48[0x24] + fVar173 + fVar147 * pfVar48[4];
                        fVar174 = fVar3 * pfVar48[0x25] + fVar174 + fVar147 * pfVar48[5];
                        fVar175 = fVar3 * pfVar48[0x26] + fVar175 + fVar147 * pfVar48[6];
                        fVar176 = fVar3 + fVar176 + fVar147;
                        fVar147 = pfVar52[iVar22 * 5];
                        fVar3 = pfVar52[iVar22 * 6];
                        fVar179 = fVar179 + fVar147 * pfVar48[0x28];
                        fVar180 = fVar180 + fVar147 * pfVar48[0x29];
                        fVar181 = fVar181 + fVar147 * pfVar48[0x2a];
                        fVar182 = fVar182 + fVar147 * pfVar48[0x2b];
                        fVar183 = fVar183 + fVar147 * pfVar48[0x2c];
                        fVar184 = fVar184 + fVar147 * pfVar48[0x2d];
                        fVar185 = fVar185 + fVar147 * pfVar48[0x2e];
                        fVar186 = fVar186 + fVar1 + fVar147;
                        fVar65 = fVar2 * pfVar48[0x10] + fVar65 + fVar3 * pfVar48[0x30];
                        fVar80 = fVar2 * pfVar48[0x11] + fVar80 + fVar3 * pfVar48[0x31];
                        fVar81 = fVar2 * pfVar48[0x12] + fVar81 + fVar3 * pfVar48[0x32];
                        fVar82 = fVar2 * pfVar48[0x13] + fVar82 + fVar3 * pfVar48[0x33];
                        fVar83 = fVar2 * pfVar48[0x14] + fVar83 + fVar3 * pfVar48[0x34];
                        fVar84 = fVar2 * pfVar48[0x15] + fVar84 + fVar3 * pfVar48[0x35];
                        fVar85 = fVar2 * pfVar48[0x16] + fVar85 + fVar3 * pfVar48[0x36];
                        fVar86 = fVar2 + fVar86 + fVar147;
                        fVar147 = pfVar52[iVar22 * 7];
                        auVar153 = ZEXT3264(CONCAT428(fVar143 + auVar153._28_4_ + fVar147,
                                                      CONCAT424(fVar143 * pfVar48[0x1e] +
                                                                auVar153._24_4_ +
                                                                fVar147 * pfVar48[0x3e],
                                                                CONCAT420(fVar143 * pfVar48[0x1d] +
                                                                          auVar153._20_4_ +
                                                                          fVar147 * pfVar48[0x3d],
                                                                          CONCAT416(fVar143 * 
                                                  pfVar48[0x1c] + auVar153._16_4_ +
                                                  fVar147 * pfVar48[0x3c],
                                                  CONCAT412(fVar143 * pfVar48[0x1b] +
                                                            auVar153._12_4_ +
                                                            fVar147 * pfVar48[0x3b],
                                                            CONCAT48(fVar143 * pfVar48[0x1a] +
                                                                     auVar153._8_4_ +
                                                                     fVar147 * pfVar48[0x3a],
                                                                     CONCAT44(fVar143 * pfVar48[0x19
                                                  ] + auVar153._4_4_ + fVar147 * pfVar48[0x39],
                                                  fVar143 * pfVar48[0x18] + auVar153._0_4_ +
                                                  fVar147 * pfVar48[0x38]))))))));
                        pfVar48 = pfVar48 + 0x40;
                        pfVar52 = pfVar52 + lVar26;
                        iVar40 = iVar40 + -1;
                      } while (iVar40 != 0);
                    }
                  }
LAB_0053c9ff:
                  iVar40 = iVar41 + 0xf;
                  iVar41 = iVar41 + 8;
                  uVar23 = uVar49 & 0xfffffff8;
                } while (iVar40 < (int)uVar49);
              }
              auVar64 = auVar153._0_32_;
              if ((int)(uVar23 | 3) < (int)uVar49) {
                uVar50 = uVar23;
                do {
                  lVar29 = (long)((int)uVar50 / local_c8.elempack) *
                           (long)local_c8.w * local_c8.elemsize;
                  if (local_c8.elempack == 4) {
                    if (0 < iVar5) {
                      pfVar52 = (float *)((long)(_func_int ***)local_c8.data +
                                         lVar29 + (long)iVar42 * 4);
                      iVar41 = iVar5;
                      do {
                        fVar147 = *pfVar52;
                        fVar168 = fVar168 + fVar147 * *pfVar48;
                        fVar170 = fVar170 + fVar147 * pfVar48[1];
                        fVar171 = fVar171 + fVar147 * pfVar48[2];
                        fVar172 = fVar172 + fVar147 * pfVar48[3];
                        fVar173 = fVar173 + fVar147 * pfVar48[4];
                        fVar174 = fVar174 + fVar147 * pfVar48[5];
                        fVar175 = fVar175 + fVar147 * pfVar48[6];
                        fVar176 = fVar176 + fVar147;
                        fVar147 = pfVar52[1];
                        fVar1 = pfVar52[2];
                        in_ZMM3 = ZEXT3264(CONCAT428(fVar1,CONCAT424(fVar1,CONCAT420(fVar1,CONCAT416
                                                  (fVar1,CONCAT412(fVar1,CONCAT48(fVar1,CONCAT44(
                                                  fVar1,fVar1))))))));
                        fVar179 = fVar179 + fVar147 * pfVar48[8];
                        fVar180 = fVar180 + fVar147 * pfVar48[9];
                        fVar181 = fVar181 + fVar147 * pfVar48[10];
                        fVar182 = fVar182 + fVar147 * pfVar48[0xb];
                        fVar183 = fVar183 + fVar147 * pfVar48[0xc];
                        fVar184 = fVar184 + fVar147 * pfVar48[0xd];
                        fVar185 = fVar185 + fVar147 * pfVar48[0xe];
                        fVar186 = fVar186 + fVar147;
                        fVar65 = fVar1 * pfVar48[0x10] + fVar65;
                        fVar80 = fVar1 * pfVar48[0x11] + fVar80;
                        fVar81 = fVar1 * pfVar48[0x12] + fVar81;
                        fVar82 = fVar1 * pfVar48[0x13] + fVar82;
                        fVar83 = fVar1 * pfVar48[0x14] + fVar83;
                        fVar84 = fVar1 * pfVar48[0x15] + fVar84;
                        fVar85 = fVar1 * pfVar48[0x16] + fVar85;
                        fVar86 = fVar147 + fVar86;
                        fVar147 = pfVar52[3];
                        auVar153 = ZEXT3264(CONCAT428(fVar147 + auVar153._28_4_,
                                                      CONCAT424(fVar147 * pfVar48[0x1e] +
                                                                auVar153._24_4_,
                                                                CONCAT420(fVar147 * pfVar48[0x1d] +
                                                                          auVar153._20_4_,
                                                                          CONCAT416(fVar147 * 
                                                  pfVar48[0x1c] + auVar153._16_4_,
                                                  CONCAT412(fVar147 * pfVar48[0x1b] +
                                                            auVar153._12_4_,
                                                            CONCAT48(fVar147 * pfVar48[0x1a] +
                                                                     auVar153._8_4_,
                                                                     CONCAT44(fVar147 * pfVar48[0x19
                                                  ] + auVar153._4_4_,
                                                  fVar147 * pfVar48[0x18] + auVar153._0_4_))))))));
                        pfVar48 = pfVar48 + 0x20;
                        pfVar52 = pfVar52 + iVar6 * 4;
                        iVar41 = iVar41 + -1;
                      } while (iVar41 != 0);
                      goto LAB_0053cada;
                    }
                  }
                  else {
                    pfVar52 = (float *)((long)(_func_int ***)local_c8.data +
                                       lVar29 + (long)(iVar47 * local_c8.elempack * local_198._0_4_)
                                                * 4);
LAB_0053cada:
                    if ((local_c8.elempack == 1) && (iVar41 = iVar5, 0 < iVar5)) {
                      do {
                        fVar147 = *pfVar52;
                        fVar168 = fVar168 + fVar147 * *pfVar48;
                        fVar170 = fVar170 + fVar147 * pfVar48[1];
                        fVar171 = fVar171 + fVar147 * pfVar48[2];
                        fVar172 = fVar172 + fVar147 * pfVar48[3];
                        fVar173 = fVar173 + fVar147 * pfVar48[4];
                        fVar174 = fVar174 + fVar147 * pfVar48[5];
                        fVar175 = fVar175 + fVar147 * pfVar48[6];
                        fVar176 = fVar176 + fVar147;
                        fVar147 = pfVar52[lVar58];
                        fVar1 = pfVar52[iVar22 * 2];
                        in_ZMM3 = ZEXT3264(CONCAT428(fVar1,CONCAT424(fVar1,CONCAT420(fVar1,CONCAT416
                                                  (fVar1,CONCAT412(fVar1,CONCAT48(fVar1,CONCAT44(
                                                  fVar1,fVar1))))))));
                        fVar179 = fVar179 + fVar147 * pfVar48[8];
                        fVar180 = fVar180 + fVar147 * pfVar48[9];
                        fVar181 = fVar181 + fVar147 * pfVar48[10];
                        fVar182 = fVar182 + fVar147 * pfVar48[0xb];
                        fVar183 = fVar183 + fVar147 * pfVar48[0xc];
                        fVar184 = fVar184 + fVar147 * pfVar48[0xd];
                        fVar185 = fVar185 + fVar147 * pfVar48[0xe];
                        fVar186 = fVar186 + fVar147;
                        fVar65 = fVar1 * pfVar48[0x10] + fVar65;
                        fVar80 = fVar1 * pfVar48[0x11] + fVar80;
                        fVar81 = fVar1 * pfVar48[0x12] + fVar81;
                        fVar82 = fVar1 * pfVar48[0x13] + fVar82;
                        fVar83 = fVar1 * pfVar48[0x14] + fVar83;
                        fVar84 = fVar1 * pfVar48[0x15] + fVar84;
                        fVar85 = fVar1 * pfVar48[0x16] + fVar85;
                        fVar86 = fVar147 + fVar86;
                        fVar147 = pfVar52[iVar22 * 3];
                        auVar153 = ZEXT3264(CONCAT428(fVar147 + auVar153._28_4_,
                                                      CONCAT424(fVar147 * pfVar48[0x1e] +
                                                                auVar153._24_4_,
                                                                CONCAT420(fVar147 * pfVar48[0x1d] +
                                                                          auVar153._20_4_,
                                                                          CONCAT416(fVar147 * 
                                                  pfVar48[0x1c] + auVar153._16_4_,
                                                  CONCAT412(fVar147 * pfVar48[0x1b] +
                                                            auVar153._12_4_,
                                                            CONCAT48(fVar147 * pfVar48[0x1a] +
                                                                     auVar153._8_4_,
                                                                     CONCAT44(fVar147 * pfVar48[0x19
                                                  ] + auVar153._4_4_,
                                                  fVar147 * pfVar48[0x18] + auVar153._0_4_))))))));
                        pfVar48 = pfVar48 + 0x20;
                        pfVar52 = pfVar52 + lVar26;
                        iVar41 = iVar41 + -1;
                      } while (iVar41 != 0);
                    }
                  }
                  auVar64 = auVar153._0_32_;
                  uVar23 = uVar50 + 4;
                  iVar41 = uVar50 + 7;
                  uVar50 = uVar23;
                } while (iVar41 < (int)uVar49);
              }
              uVar30 = (ulong)uVar23;
              if ((int)(uVar23 | 1) < (int)uVar49) {
                lVar36 = (long)local_c8.w * local_c8.elemsize * uVar30;
                lVar57 = (long)(_func_int ***)local_c8.data + lVar36 + local_140;
                lVar29 = (long)local_c8.w * local_c8.elemsize * 2;
                lVar36 = (long)(_func_int ***)local_c8.data + lVar36 + local_108._0_8_;
                do {
                  if (0 < iVar5) {
                    lVar37 = 0;
                    iVar41 = iVar5;
                    do {
                      fVar147 = *(float *)(lVar36 + lVar37);
                      fVar168 = fVar168 + fVar147 * *pfVar48;
                      fVar170 = fVar170 + fVar147 * pfVar48[1];
                      fVar171 = fVar171 + fVar147 * pfVar48[2];
                      fVar172 = fVar172 + fVar147 * pfVar48[3];
                      fVar173 = fVar173 + fVar147 * pfVar48[4];
                      fVar174 = fVar174 + fVar147 * pfVar48[5];
                      fVar175 = fVar175 + fVar147 * pfVar48[6];
                      fVar176 = fVar176 + fVar147;
                      fVar147 = *(float *)(lVar57 + lVar37);
                      fVar179 = fVar179 + fVar147 * pfVar48[8];
                      fVar180 = fVar180 + fVar147 * pfVar48[9];
                      fVar181 = fVar181 + fVar147 * pfVar48[10];
                      fVar182 = fVar182 + fVar147 * pfVar48[0xb];
                      fVar183 = fVar183 + fVar147 * pfVar48[0xc];
                      fVar184 = fVar184 + fVar147 * pfVar48[0xd];
                      fVar185 = fVar185 + fVar147 * pfVar48[0xe];
                      fVar186 = fVar186 + fVar147;
                      pfVar48 = pfVar48 + 0x10;
                      lVar37 = lVar37 + lVar26 * 4;
                      iVar41 = iVar41 + -1;
                    } while (iVar41 != 0);
                  }
                  uVar30 = uVar30 + 2;
                  uVar23 = (uint)uVar30;
                  lVar57 = lVar57 + lVar29;
                  lVar36 = lVar36 + lVar29;
                } while ((int)(uVar23 | 1) < (int)uVar49);
              }
              if ((int)uVar23 < (int)uVar49) {
                uVar30 = (ulong)uVar23;
                pfVar52 = (float *)((long)(_func_int ***)local_c8.data +
                                   (long)local_c8.w * local_c8.elemsize * uVar30 + local_108._0_8_);
                do {
                  pfVar33 = pfVar52;
                  iVar41 = iVar5;
                  if (0 < iVar5) {
                    do {
                      fVar147 = *pfVar33;
                      fVar168 = fVar168 + fVar147 * *pfVar48;
                      fVar170 = fVar170 + fVar147 * pfVar48[1];
                      fVar171 = fVar171 + fVar147 * pfVar48[2];
                      fVar172 = fVar172 + fVar147 * pfVar48[3];
                      fVar173 = fVar173 + fVar147 * pfVar48[4];
                      fVar174 = fVar174 + fVar147 * pfVar48[5];
                      fVar175 = fVar175 + fVar147 * pfVar48[6];
                      fVar176 = fVar176 + fVar147;
                      pfVar48 = pfVar48 + 8;
                      pfVar33 = pfVar33 + lVar26;
                      iVar41 = iVar41 + -1;
                    } while (iVar41 != 0);
                  }
                  uVar30 = uVar30 + 1;
                  pfVar52 = (float *)((long)pfVar52 + (long)local_c8.w * local_c8.elemsize);
                } while ((int)uVar30 < (int)uVar49);
              }
              fVar65 = fVar65 + auVar64._0_4_ + fVar179 + fVar168;
              fVar80 = fVar80 + auVar64._4_4_ + fVar180 + fVar170;
              auVar77._0_8_ = CONCAT44(fVar80,fVar65);
              auVar77._8_4_ = fVar81 + auVar64._8_4_ + fVar181 + fVar171;
              auVar77._12_4_ = fVar82 + auVar64._12_4_ + fVar182 + fVar172;
              auVar77._16_4_ = fVar83 + auVar64._16_4_ + fVar183 + fVar173;
              auVar77._20_4_ = fVar84 + auVar64._20_4_ + fVar184 + fVar174;
              auVar77._24_4_ = fVar85 + auVar64._24_4_ + fVar185 + fVar175;
              auVar77._28_4_ = fVar86 + auVar64._28_4_ + fVar186 + fVar176;
              auVar106 = auVar165._0_32_;
              fVar81 = auVar167._0_4_;
              fVar82 = auVar167._4_4_;
              fVar83 = auVar167._8_4_;
              fVar84 = auVar167._12_4_;
              fVar85 = auVar167._16_4_;
              fVar86 = auVar167._20_4_;
              fVar179 = auVar167._24_4_;
              fVar180 = auVar167._28_4_;
              auVar64 = auVar148._0_32_;
              fVar168 = auVar148._0_4_;
              fVar170 = auVar148._4_4_;
              fVar171 = auVar148._8_4_;
              fVar172 = auVar148._12_4_;
              fVar173 = auVar148._16_4_;
              fVar174 = auVar148._20_4_;
              fVar175 = auVar148._24_4_;
              fVar176 = auVar148._28_4_;
              switch(uVar35) {
              case 1:
                auVar77 = vmaxps_avx(auVar106,auVar77);
                break;
              case 2:
                auVar64 = vmaxps_avx(auVar106,auVar77);
                auVar106 = vminps_avx(auVar106,auVar77);
                fVar168 = *(this->super_Convolution1D).activation_params.data;
                in_ZMM3 = ZEXT3264(CONCAT428(fVar168,CONCAT424(fVar168,CONCAT420(fVar168,CONCAT416(
                                                  fVar168,CONCAT412(fVar168,CONCAT48(fVar168,
                                                  CONCAT44(fVar168,fVar168))))))));
                auVar77._0_4_ = fVar168 * auVar106._0_4_ + auVar64._0_4_;
                auVar77._4_4_ = fVar168 * auVar106._4_4_ + auVar64._4_4_;
                auVar77._8_4_ = fVar168 * auVar106._8_4_ + auVar64._8_4_;
                auVar77._12_4_ = fVar168 * auVar106._12_4_ + auVar64._12_4_;
                auVar77._16_4_ = fVar168 * auVar106._16_4_ + auVar64._16_4_;
                auVar77._20_4_ = fVar168 * auVar106._20_4_ + auVar64._20_4_;
                auVar77._24_4_ = fVar168 * auVar106._24_4_ + auVar64._24_4_;
                auVar77._28_4_ = auVar106._28_4_ + auVar64._28_4_;
                break;
              case 3:
                puVar54 = (undefined4 *)(this->super_Convolution1D).activation_params.data;
                uVar7 = *puVar54;
                auVar109._4_4_ = uVar7;
                auVar109._0_4_ = uVar7;
                auVar109._8_4_ = uVar7;
                auVar109._12_4_ = uVar7;
                auVar109._16_4_ = uVar7;
                auVar109._20_4_ = uVar7;
                auVar109._24_4_ = uVar7;
                auVar109._28_4_ = uVar7;
                uVar7 = puVar54[1];
                auVar136._4_4_ = uVar7;
                auVar136._0_4_ = uVar7;
                auVar136._8_4_ = uVar7;
                auVar136._12_4_ = uVar7;
                auVar136._16_4_ = uVar7;
                auVar136._20_4_ = uVar7;
                auVar136._24_4_ = uVar7;
                auVar136._28_4_ = uVar7;
                in_ZMM3 = ZEXT3264(auVar136);
                auVar64 = vmaxps_avx(auVar77,auVar109);
                auVar77 = vminps_avx(auVar64,auVar136);
                break;
              case 4:
                auVar78._0_8_ = auVar77._0_8_ ^ 0x8000000080000000;
                auVar78._8_4_ = -auVar77._8_4_;
                auVar78._12_4_ = -auVar77._12_4_;
                auVar78._16_4_ = -auVar77._16_4_;
                auVar78._20_4_ = -auVar77._20_4_;
                auVar78._24_4_ = -auVar77._24_4_;
                auVar78._28_4_ = -auVar77._28_4_;
                auVar110._8_4_ = 0x42b0c0a5;
                auVar110._0_8_ = 0x42b0c0a542b0c0a5;
                auVar110._12_4_ = 0x42b0c0a5;
                auVar110._16_4_ = 0x42b0c0a5;
                auVar110._20_4_ = 0x42b0c0a5;
                auVar110._24_4_ = 0x42b0c0a5;
                auVar110._28_4_ = 0x42b0c0a5;
                auVar77 = vminps_avx(auVar78,auVar110);
                auVar111._8_4_ = 0xc2b0c0a5;
                auVar111._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar111._12_4_ = 0xc2b0c0a5;
                auVar111._16_4_ = 0xc2b0c0a5;
                auVar111._20_4_ = 0xc2b0c0a5;
                auVar111._24_4_ = 0xc2b0c0a5;
                auVar111._28_4_ = 0xc2b0c0a5;
                auVar106 = vmaxps_avx(auVar77,auVar111);
                auVar112._0_4_ = fVar81 + auVar106._0_4_ * 1.442695;
                auVar112._4_4_ = fVar82 + auVar106._4_4_ * 1.442695;
                auVar112._8_4_ = fVar83 + auVar106._8_4_ * 1.442695;
                auVar112._12_4_ = fVar84 + auVar106._12_4_ * 1.442695;
                auVar112._16_4_ = fVar85 + auVar106._16_4_ * 1.442695;
                auVar112._20_4_ = fVar86 + auVar106._20_4_ * 1.442695;
                auVar112._24_4_ = fVar179 + auVar106._24_4_ * 1.442695;
                auVar112._28_4_ = fVar180 + 1.442695;
                auVar114 = vroundps_avx(auVar112,1);
                auVar77 = vcmpps_avx(auVar112,auVar114,1);
                auVar77 = vandps_avx(auVar77,auVar64);
                auVar77 = vsubps_avx(auVar114,auVar77);
                fVar65 = auVar106._0_4_ + auVar77._0_4_ * -0.6931472;
                fVar80 = auVar106._4_4_ + auVar77._4_4_ * -0.6931472;
                fVar180 = auVar106._8_4_ + auVar77._8_4_ * -0.6931472;
                fVar181 = auVar106._12_4_ + auVar77._12_4_ * -0.6931472;
                fVar182 = auVar106._16_4_ + auVar77._16_4_ * -0.6931472;
                fVar183 = auVar106._20_4_ + auVar77._20_4_ * -0.6931472;
                fVar184 = auVar106._24_4_ + auVar77._24_4_ * -0.6931472;
                auVar87._0_4_ = (int)auVar77._0_4_;
                auVar87._4_4_ = (int)auVar77._4_4_;
                auVar87._8_4_ = (int)auVar77._8_4_;
                auVar87._12_4_ = (int)auVar77._12_4_;
                auVar113._16_4_ = (int)auVar77._16_4_;
                auVar113._0_16_ = auVar87;
                auVar113._20_4_ = (int)auVar77._20_4_;
                auVar113._24_4_ = (int)auVar77._24_4_;
                auVar113._28_4_ = (int)auVar77._28_4_;
                auVar149 = vpslld_avx(auVar87,0x17);
                auVar117 = vpslld_avx(auVar113._16_16_,0x17);
                auVar60._8_4_ = 0x3f800000;
                auVar60._0_8_ = 0x3f8000003f800000;
                auVar60._12_4_ = 0x3f800000;
                auVar117 = vpaddd_avx(auVar117,auVar60);
                auVar149 = vpaddd_avx(auVar149,auVar60);
                in_ZMM3 = ZEXT1664(auVar149);
                auVar79._0_4_ =
                     (fVar65 + fVar168 +
                     fVar65 * fVar65 *
                     (fVar81 + ((((fVar65 * 0.00019875691 + 0.0013981999) * fVar65 + 0.008333452) *
                                 fVar65 + 0.041665796) * fVar65 + 0.16666666) * fVar65)) *
                     auVar149._0_4_ + fVar168;
                auVar79._4_4_ =
                     (fVar80 + fVar170 +
                     fVar80 * fVar80 *
                     (fVar82 + ((((fVar80 * 0.00019875691 + 0.0013981999) * fVar80 + 0.008333452) *
                                 fVar80 + 0.041665796) * fVar80 + 0.16666666) * fVar80)) *
                     auVar149._4_4_ + fVar170;
                auVar79._8_4_ =
                     (fVar180 + fVar171 +
                     fVar180 * fVar180 *
                     (fVar83 + ((((fVar180 * 0.00019875691 + 0.0013981999) * fVar180 + 0.008333452)
                                 * fVar180 + 0.041665796) * fVar180 + 0.16666666) * fVar180)) *
                     auVar149._8_4_ + fVar171;
                auVar79._12_4_ =
                     (fVar181 + fVar172 +
                     fVar181 * fVar181 *
                     (fVar84 + ((((fVar181 * 0.00019875691 + 0.0013981999) * fVar181 + 0.008333452)
                                 * fVar181 + 0.041665796) * fVar181 + 0.16666666) * fVar181)) *
                     auVar149._12_4_ + fVar172;
                auVar79._16_4_ =
                     (fVar182 + fVar173 +
                     fVar182 * fVar182 *
                     (fVar85 + ((((fVar182 * 0.00019875691 + 0.0013981999) * fVar182 + 0.008333452)
                                 * fVar182 + 0.041665796) * fVar182 + 0.16666666) * fVar182)) *
                     auVar117._0_4_ + fVar173;
                auVar79._20_4_ =
                     (fVar183 + fVar174 +
                     fVar183 * fVar183 *
                     (fVar86 + ((((fVar183 * 0.00019875691 + 0.0013981999) * fVar183 + 0.008333452)
                                 * fVar183 + 0.041665796) * fVar183 + 0.16666666) * fVar183)) *
                     auVar117._4_4_ + fVar174;
                auVar79._24_4_ =
                     (fVar184 + fVar175 +
                     fVar184 * fVar184 *
                     (fVar179 +
                     ((((fVar184 * 0.00019875691 + 0.0013981999) * fVar184 + 0.008333452) * fVar184
                      + 0.041665796) * fVar184 + 0.16666666) * fVar184)) * auVar117._8_4_ + fVar175;
                auVar79._28_4_ = auVar106._28_4_ + -0.6931472 + fVar176 + -0.6931472 + fVar176;
                auVar77 = vdivps_avx(auVar64,auVar79);
                break;
              case 5:
                auVar164._8_4_ = 0x42b0c0a5;
                auVar164._0_8_ = 0x42b0c0a542b0c0a5;
                auVar164._12_4_ = 0x42b0c0a5;
                auVar164._16_4_ = 0x42b0c0a5;
                auVar164._20_4_ = 0x42b0c0a5;
                auVar164._24_4_ = 0x42b0c0a5;
                auVar164._28_4_ = 0x42b0c0a5;
                auVar106 = vminps_avx(auVar164,auVar77);
                auVar166._8_4_ = 0xc2b0c0a5;
                auVar166._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar166._12_4_ = 0xc2b0c0a5;
                auVar166._16_4_ = 0xc2b0c0a5;
                auVar166._20_4_ = 0xc2b0c0a5;
                auVar166._24_4_ = 0xc2b0c0a5;
                auVar166._28_4_ = 0xc2b0c0a5;
                auVar114 = vmaxps_avx(auVar166,auVar106);
                auVar129._0_4_ = fVar81 + auVar114._0_4_ * 1.442695;
                auVar129._4_4_ = fVar82 + auVar114._4_4_ * 1.442695;
                auVar129._8_4_ = fVar83 + auVar114._8_4_ * 1.442695;
                auVar129._12_4_ = fVar84 + auVar114._12_4_ * 1.442695;
                auVar129._16_4_ = fVar85 + auVar114._16_4_ * 1.442695;
                auVar129._20_4_ = fVar86 + auVar114._20_4_ * 1.442695;
                auVar129._24_4_ = fVar179 + auVar114._24_4_ * 1.442695;
                auVar129._28_4_ = fVar180 + in_ZMM3._28_4_;
                auVar135 = vroundps_avx(auVar129,1);
                auVar106 = vcmpps_avx(auVar129,auVar135,1);
                auVar106 = vandps_avx(auVar106,auVar64);
                auVar106 = vsubps_avx(auVar135,auVar106);
                auVar14._4_4_ = auVar106._4_4_ * 0.6931472;
                auVar14._0_4_ = auVar106._0_4_ * 0.6931472;
                auVar14._8_4_ = auVar106._8_4_ * 0.6931472;
                auVar14._12_4_ = auVar106._12_4_ * 0.6931472;
                auVar14._16_4_ = auVar106._16_4_ * 0.6931472;
                auVar14._20_4_ = auVar106._20_4_ * 0.6931472;
                auVar14._24_4_ = auVar106._24_4_ * 0.6931472;
                auVar14._28_4_ = auVar135._28_4_;
                auVar114 = vsubps_avx(auVar114,auVar14);
                fVar181 = auVar114._0_4_;
                fVar182 = auVar114._4_4_;
                fVar183 = auVar114._8_4_;
                fVar184 = auVar114._12_4_;
                fVar185 = auVar114._16_4_;
                fVar186 = auVar114._20_4_;
                fVar147 = auVar114._24_4_;
                auVar116._0_4_ = (int)auVar106._0_4_;
                auVar116._4_4_ = (int)auVar106._4_4_;
                auVar116._8_4_ = (int)auVar106._8_4_;
                auVar116._12_4_ = (int)auVar106._12_4_;
                auVar130._16_4_ = (int)auVar106._16_4_;
                auVar130._0_16_ = auVar116;
                auVar130._20_4_ = (int)auVar106._20_4_;
                auVar130._24_4_ = (int)auVar106._24_4_;
                auVar130._28_4_ = (int)auVar106._28_4_;
                auVar149 = vpslld_avx(auVar116,0x17);
                auVar117 = vpslld_avx(auVar130._16_16_,0x17);
                auVar144._8_4_ = 0x3f800000;
                auVar144._0_8_ = 0x3f8000003f800000;
                auVar144._12_4_ = 0x3f800000;
                in_ZMM4 = ZEXT1664(auVar144);
                auVar117 = vpaddd_avx(auVar117,auVar144);
                auVar149 = vpaddd_avx(auVar149,auVar144);
                auVar152._0_4_ =
                     (fVar181 + fVar168 +
                     fVar181 * fVar181 *
                     (((((fVar181 * 0.00019875691 + 0.0013981999) * fVar181 + 0.008333452) * fVar181
                       + 0.041665796) * fVar181 + 0.16666666) * fVar181 + fVar81)) * auVar149._0_4_
                     + fVar168;
                auVar152._4_4_ =
                     (fVar182 + fVar170 +
                     fVar182 * fVar182 *
                     (((((fVar182 * 0.00019875691 + 0.0013981999) * fVar182 + 0.008333452) * fVar182
                       + 0.041665796) * fVar182 + 0.16666666) * fVar182 + fVar82)) * auVar149._4_4_
                     + fVar170;
                auVar152._8_4_ =
                     (fVar183 + fVar171 +
                     fVar183 * fVar183 *
                     (((((fVar183 * 0.00019875691 + 0.0013981999) * fVar183 + 0.008333452) * fVar183
                       + 0.041665796) * fVar183 + 0.16666666) * fVar183 + fVar83)) * auVar149._8_4_
                     + fVar171;
                auVar152._12_4_ =
                     (fVar184 + fVar172 +
                     fVar184 * fVar184 *
                     (((((fVar184 * 0.00019875691 + 0.0013981999) * fVar184 + 0.008333452) * fVar184
                       + 0.041665796) * fVar184 + 0.16666666) * fVar184 + fVar84)) * auVar149._12_4_
                     + fVar172;
                auVar152._16_4_ =
                     (fVar185 + fVar173 +
                     fVar185 * fVar185 *
                     (((((fVar185 * 0.00019875691 + 0.0013981999) * fVar185 + 0.008333452) * fVar185
                       + 0.041665796) * fVar185 + 0.16666666) * fVar185 + fVar85)) * auVar117._0_4_
                     + fVar173;
                auVar152._20_4_ =
                     (fVar186 + fVar174 +
                     fVar186 * fVar186 *
                     (((((fVar186 * 0.00019875691 + 0.0013981999) * fVar186 + 0.008333452) * fVar186
                       + 0.041665796) * fVar186 + 0.16666666) * fVar186 + fVar86)) * auVar117._4_4_
                     + fVar174;
                auVar152._24_4_ =
                     (fVar147 + fVar175 +
                     fVar147 * fVar147 *
                     (((((fVar147 * 0.00019875691 + 0.0013981999) * fVar147 + 0.008333452) * fVar147
                       + 0.041665796) * fVar147 + 0.16666666) * fVar147 + fVar179)) * auVar117._8_4_
                     + fVar175;
                auVar152._28_4_ = auVar114._28_4_ + fVar176 + auVar135._28_4_ + fVar176;
                auVar106._8_4_ = 0x800000;
                auVar106._0_8_ = 0x80000000800000;
                auVar106._12_4_ = 0x800000;
                auVar106._16_4_ = 0x800000;
                auVar106._20_4_ = 0x800000;
                auVar106._24_4_ = 0x800000;
                auVar106._28_4_ = 0x800000;
                auVar135 = vmaxps_avx(auVar152,auVar106);
                auVar117 = vpsrld_avx(auVar135._16_16_,0x17);
                auVar162._8_4_ = 0x807fffff;
                auVar162._0_8_ = 0x807fffff807fffff;
                auVar162._12_4_ = 0x807fffff;
                auVar162._16_4_ = 0x807fffff;
                auVar162._20_4_ = 0x807fffff;
                auVar162._24_4_ = 0x807fffff;
                auVar162._28_4_ = 0x807fffff;
                auVar106 = vandps_avx(auVar135,auVar162);
                auVar14 = vorps_avx(auVar106,auVar167._0_32_);
                auVar169._8_4_ = 0x3f3504f3;
                auVar169._0_8_ = 0x3f3504f33f3504f3;
                auVar169._12_4_ = 0x3f3504f3;
                auVar169._16_4_ = 0x3f3504f3;
                auVar169._20_4_ = 0x3f3504f3;
                auVar169._24_4_ = 0x3f3504f3;
                auVar169._28_4_ = 0x3f3504f3;
                auVar114 = vcmpps_avx(auVar169,auVar14,2);
                auVar106 = vandnps_avx(auVar114,auVar14);
                fVar181 = auVar106._0_4_ + auVar14._0_4_ + -1.0;
                fVar182 = auVar106._4_4_ + auVar14._4_4_ + -1.0;
                fVar183 = auVar106._8_4_ + auVar14._8_4_ + -1.0;
                fVar184 = auVar106._12_4_ + auVar14._12_4_ + -1.0;
                fVar185 = auVar106._16_4_ + auVar14._16_4_ + -1.0;
                fVar186 = auVar106._20_4_ + auVar14._20_4_ + -1.0;
                fVar147 = auVar106._24_4_ + auVar14._24_4_ + -1.0;
                auVar117 = vpsubd_avx(auVar117,auVar114._16_16_);
                auVar149 = vpsrld_avx(auVar135._0_16_,0x17);
                auVar154._8_4_ = 0xffffff81;
                auVar154._0_8_ = 0xffffff81ffffff81;
                auVar154._12_4_ = 0xffffff81;
                auVar117 = vpaddd_avx(auVar117,auVar154);
                auVar149 = vpsubd_avx(auVar149,auVar114._0_16_);
                auVar149 = vpaddd_avx(auVar149,auVar154);
                auVar107._16_16_ = auVar117;
                auVar107._0_16_ = auVar149;
                auVar114 = vcmpps_avx(auVar152,_DAT_005a8520,2);
                auVar135 = vcvtdq2ps_avx(auVar107);
                auVar15._4_4_ =
                     (fVar182 + auVar135._4_4_ * 0.6931472 +
                     fVar182 * fVar182 *
                     (fVar182 * (fVar182 * (fVar182 * (fVar182 * (fVar182 * (fVar182 * (fVar182 * (
                                                  fVar182 * (fVar182 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar15._0_4_ =
                     (fVar181 + auVar135._0_4_ * 0.6931472 +
                     fVar181 * fVar181 *
                     (fVar181 * (fVar181 * (fVar181 * (fVar181 * (fVar181 * (fVar181 * (fVar181 * (
                                                  fVar181 * (fVar181 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar15._8_4_ =
                     (fVar183 + auVar135._8_4_ * 0.6931472 +
                     fVar183 * fVar183 *
                     (fVar183 * (fVar183 * (fVar183 * (fVar183 * (fVar183 * (fVar183 * (fVar183 * (
                                                  fVar183 * (fVar183 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar15._12_4_ =
                     (fVar184 + auVar135._12_4_ * 0.6931472 +
                     fVar184 * fVar184 *
                     (fVar184 * (fVar184 * (fVar184 * (fVar184 * (fVar184 * (fVar184 * (fVar184 * (
                                                  fVar184 * (fVar184 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar15._16_4_ =
                     (fVar185 + auVar135._16_4_ * 0.6931472 +
                     fVar185 * fVar185 *
                     (fVar185 * (fVar185 * (fVar185 * (fVar185 * (fVar185 * (fVar185 * (fVar185 * (
                                                  fVar185 * (fVar185 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar15._20_4_ =
                     (fVar186 + auVar135._20_4_ * 0.6931472 +
                     fVar186 * fVar186 *
                     (fVar186 * (fVar186 * (fVar186 * (fVar186 * (fVar186 * (fVar186 * (fVar186 * (
                                                  fVar186 * (fVar186 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar15._24_4_ =
                     (fVar147 + auVar135._24_4_ * 0.6931472 +
                     fVar147 * fVar147 *
                     (fVar147 * (fVar147 * (fVar147 * (fVar147 * (fVar147 * (fVar147 * (fVar147 * (
                                                  fVar147 * (fVar147 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar15._28_4_ = auVar106._28_4_ + auVar14._28_4_ + -1.0 + auVar135._28_4_ + 0.0;
                auVar131._8_4_ = 0x7fffffff;
                auVar131._0_8_ = 0x7fffffff7fffffff;
                auVar131._12_4_ = 0x7fffffff;
                auVar131._16_4_ = 0x7fffffff;
                auVar131._20_4_ = 0x7fffffff;
                auVar131._24_4_ = 0x7fffffff;
                auVar131._28_4_ = 0x7fffffff;
                auVar106 = vblendvps_avx(auVar15,auVar131,auVar114);
                auVar132._8_4_ = 0x42b0c0a5;
                auVar132._0_8_ = 0x42b0c0a542b0c0a5;
                auVar132._12_4_ = 0x42b0c0a5;
                auVar132._16_4_ = 0x42b0c0a5;
                auVar132._20_4_ = 0x42b0c0a5;
                auVar132._24_4_ = 0x42b0c0a5;
                auVar132._28_4_ = 0x42b0c0a5;
                auVar106 = vminps_avx(auVar106,auVar132);
                auVar114 = vmaxps_avx(auVar166,auVar106);
                auVar133._0_4_ = auVar114._0_4_ * 1.442695 + fVar81;
                auVar133._4_4_ = auVar114._4_4_ * 1.442695 + fVar82;
                auVar133._8_4_ = auVar114._8_4_ * 1.442695 + fVar83;
                auVar133._12_4_ = auVar114._12_4_ * 1.442695 + fVar84;
                auVar133._16_4_ = auVar114._16_4_ * 1.442695 + fVar85;
                auVar133._20_4_ = auVar114._20_4_ * 1.442695 + fVar86;
                auVar133._24_4_ = auVar114._24_4_ * 1.442695 + fVar179;
                auVar133._28_4_ = fVar180 + 1.442695;
                auVar14 = vroundps_avx(auVar133,1);
                auVar106 = vcmpps_avx(auVar133,auVar14,1);
                auVar106 = vandps_avx(auVar106,auVar64);
                auVar106 = vsubps_avx(auVar14,auVar106);
                auVar16._4_4_ = auVar106._4_4_ * 0.6931472;
                auVar16._0_4_ = auVar106._0_4_ * 0.6931472;
                auVar16._8_4_ = auVar106._8_4_ * 0.6931472;
                auVar16._12_4_ = auVar106._12_4_ * 0.6931472;
                auVar16._16_4_ = auVar106._16_4_ * 0.6931472;
                auVar16._20_4_ = auVar106._20_4_ * 0.6931472;
                auVar16._24_4_ = auVar106._24_4_ * 0.6931472;
                auVar16._28_4_ = auVar14._28_4_;
                auVar165 = ZEXT864(0) << 0x20;
                auVar114 = vsubps_avx(auVar114,auVar16);
                fVar180 = auVar114._0_4_;
                fVar181 = auVar114._4_4_;
                fVar182 = auVar114._8_4_;
                fVar183 = auVar114._12_4_;
                fVar184 = auVar114._16_4_;
                fVar185 = auVar114._20_4_;
                fVar186 = auVar114._24_4_;
                auVar148 = ZEXT3264(auVar64);
                auVar167 = ZEXT3264(auVar167._0_32_);
                auVar118._0_4_ = (int)auVar106._0_4_;
                auVar118._4_4_ = (int)auVar106._4_4_;
                auVar118._8_4_ = (int)auVar106._8_4_;
                auVar118._12_4_ = (int)auVar106._12_4_;
                auVar134._16_4_ = (int)auVar106._16_4_;
                auVar134._0_16_ = auVar118;
                auVar134._20_4_ = (int)auVar106._20_4_;
                auVar134._24_4_ = (int)auVar106._24_4_;
                auVar134._28_4_ = (int)auVar106._28_4_;
                auVar149 = vpslld_avx(auVar118,0x17);
                auVar117 = vpslld_avx(auVar134._16_16_,0x17);
                auVar117 = vpaddd_avx(auVar117,auVar144);
                auVar149 = vpaddd_avx(auVar149,auVar144);
                auVar135._16_16_ = auVar117;
                auVar135._0_16_ = auVar149;
                auVar108._0_4_ =
                     (fVar180 + fVar168 +
                     fVar180 * fVar180 *
                     (fVar81 + ((((fVar180 * 0.00019875691 + 0.0013981999) * fVar180 + 0.008333452)
                                 * fVar180 + 0.041665796) * fVar180 + 0.16666666) * fVar180)) *
                     auVar149._0_4_ + fVar168;
                auVar108._4_4_ =
                     (fVar181 + fVar170 +
                     fVar181 * fVar181 *
                     (fVar82 + ((((fVar181 * 0.00019875691 + 0.0013981999) * fVar181 + 0.008333452)
                                 * fVar181 + 0.041665796) * fVar181 + 0.16666666) * fVar181)) *
                     auVar149._4_4_ + fVar170;
                auVar108._8_4_ =
                     (fVar182 + fVar171 +
                     fVar182 * fVar182 *
                     (fVar83 + ((((fVar182 * 0.00019875691 + 0.0013981999) * fVar182 + 0.008333452)
                                 * fVar182 + 0.041665796) * fVar182 + 0.16666666) * fVar182)) *
                     auVar149._8_4_ + fVar171;
                auVar108._12_4_ =
                     (fVar183 + fVar172 +
                     fVar183 * fVar183 *
                     (fVar84 + ((((fVar183 * 0.00019875691 + 0.0013981999) * fVar183 + 0.008333452)
                                 * fVar183 + 0.041665796) * fVar183 + 0.16666666) * fVar183)) *
                     auVar149._12_4_ + fVar172;
                auVar108._16_4_ =
                     (fVar184 + fVar173 +
                     fVar184 * fVar184 *
                     (fVar85 + ((((fVar184 * 0.00019875691 + 0.0013981999) * fVar184 + 0.008333452)
                                 * fVar184 + 0.041665796) * fVar184 + 0.16666666) * fVar184)) *
                     auVar117._0_4_ + fVar173;
                auVar108._20_4_ =
                     (fVar185 + fVar174 +
                     fVar185 * fVar185 *
                     (fVar86 + ((((fVar185 * 0.00019875691 + 0.0013981999) * fVar185 + 0.008333452)
                                 * fVar185 + 0.041665796) * fVar185 + 0.16666666) * fVar185)) *
                     auVar117._4_4_ + fVar174;
                auVar108._24_4_ =
                     (fVar186 + fVar175 +
                     fVar186 * fVar186 *
                     (fVar179 +
                     ((((fVar186 * 0.00019875691 + 0.0013981999) * fVar186 + 0.008333452) * fVar186
                      + 0.041665796) * fVar186 + 0.16666666) * fVar186)) * auVar117._8_4_ + fVar175;
                auVar108._28_4_ = auVar114._28_4_ + fVar176 + auVar14._28_4_ + fVar176;
                auVar64._8_4_ = 0x40000000;
                auVar64._0_8_ = 0x4000000040000000;
                auVar64._12_4_ = 0x40000000;
                auVar64._16_4_ = 0x40000000;
                auVar64._20_4_ = 0x40000000;
                auVar64._24_4_ = 0x40000000;
                auVar64._28_4_ = 0x40000000;
                auVar64 = vdivps_avx(auVar64,auVar108);
                auVar105._0_4_ = auVar64._0_4_ + -1.0;
                auVar105._4_4_ = auVar64._4_4_ + -1.0;
                auVar105._8_4_ = auVar64._8_4_ + -1.0;
                auVar105._12_4_ = auVar64._12_4_ + -1.0;
                auVar105._16_4_ = auVar64._16_4_ + -1.0;
                auVar105._20_4_ = auVar64._20_4_ + -1.0;
                auVar105._24_4_ = auVar64._24_4_ + -1.0;
                goto LAB_0053d103;
              case 6:
                pfVar48 = (float *)(this->super_Convolution1D).activation_params.data;
                fVar168 = *pfVar48;
                fVar170 = pfVar48[1];
                auVar135._4_4_ = fVar170;
                auVar135._0_4_ = fVar170;
                auVar135._8_4_ = fVar170;
                auVar135._12_4_ = fVar170;
                auVar135._16_4_ = fVar170;
                auVar135._20_4_ = fVar170;
                auVar135._24_4_ = fVar170;
                auVar135._28_4_ = fVar170;
                auVar114._0_4_ = fVar168 * fVar65 + fVar170;
                auVar114._4_4_ = fVar168 * fVar80 + fVar170;
                auVar114._8_4_ = fVar168 * auVar77._8_4_ + fVar170;
                auVar114._12_4_ = fVar168 * auVar77._12_4_ + fVar170;
                auVar114._16_4_ = fVar168 * auVar77._16_4_ + fVar170;
                auVar114._20_4_ = fVar168 * auVar77._20_4_ + fVar170;
                auVar114._24_4_ = fVar168 * auVar77._24_4_ + fVar170;
                auVar114._28_4_ = fVar168 + fVar170;
                auVar106 = vmaxps_avx(auVar106,auVar114);
                auVar64 = vminps_avx(auVar106,auVar64);
                auVar105 = auVar64._0_28_;
LAB_0053d103:
                in_ZMM3 = ZEXT3264(auVar135);
                auVar77._4_4_ = auVar105._4_4_ * fVar80;
                auVar77._0_4_ = auVar105._0_4_ * fVar65;
                auVar77._8_4_ = auVar105._8_4_ * auVar77._8_4_;
                auVar77._12_4_ = auVar105._12_4_ * auVar77._12_4_;
                auVar77._16_4_ = auVar105._16_4_ * auVar77._16_4_;
                auVar77._20_4_ = auVar105._20_4_ * auVar77._20_4_;
                auVar77._24_4_ = auVar105._24_4_ * auVar77._24_4_;
              }
              auVar149 = auVar77._16_16_;
              auVar117 = auVar77._0_16_;
              if (iVar44 == 1) {
                *(int *)*local_1c0 = auVar77._0_4_;
                uVar7 = vextractps_avx(auVar117,1);
                *(undefined4 *)((long)*local_1c0 + lVar53 * 4) = uVar7;
                uVar7 = vextractps_avx(auVar117,2);
                *(undefined4 *)((long)*local_1c0 + (long)(iVar55 * 2) * 4) = uVar7;
                uVar7 = vextractps_avx(auVar117,3);
                *(undefined4 *)((long)*local_1c0 + (long)(iVar55 * 3) * 4) = uVar7;
                *(int *)((long)*local_1c0 + (long)(iVar55 * 4) * 4) = auVar77._16_4_;
                uVar7 = vextractps_avx(auVar149,1);
                *(undefined4 *)((long)*local_1c0 + (long)(iVar55 * 5) * 4) = uVar7;
                uVar7 = vextractps_avx(auVar149,2);
                *(undefined4 *)((long)*local_1c0 + (long)(iVar55 * 6) * 4) = uVar7;
                uVar7 = vextractps_avx(auVar149,3);
                *(undefined4 *)((long)*local_1c0 + (long)(iVar55 * 7) * 4) = uVar7;
                local_1c0 = (undefined1 (*) [32])((long)*local_1c0 + 4);
              }
              else if (iVar44 == 4) {
                *(undefined1 (*) [16])*local_1c0 = auVar117;
                *(undefined1 (*) [16])((long)*local_1c0 + lVar53 * 4) = auVar149;
                local_1c0 = (undefined1 (*) [32])((long)*local_1c0 + 0x10);
              }
              else if (iVar44 == 8) {
                *local_1c0 = auVar77;
                local_1c0 = local_1c0 + 1;
              }
              lVar29 = local_198._0_8_ + 1;
              iVar42 = iVar42 + iVar47 * local_c8.elempack;
              local_140 = local_140 + lVar27 * 4;
              local_108._0_8_ = local_108._0_8_ + lVar27 * 4;
              local_198._0_8_ = lVar29;
            } while (lVar29 != lVar28);
          }
          local_1f0 = local_1f0 + 1;
        } while (local_1f0 != uVar39);
      }
      iVar42 = iVar25 + uVar39 * -8;
      iVar44 = iVar42 + 3;
      if (-1 < iVar42) {
        iVar44 = iVar42;
      }
      if (3 < iVar42) {
        auVar148 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar150._8_4_ = 0x3f800000;
        auVar150._0_8_ = 0x3f8000003f800000;
        auVar150._12_4_ = 0x3f800000;
        local_160 = 0;
        do {
          lVar53 = (long)top_blob->w;
          if (0 < lVar53) {
            uVar23 = local_c8.h * local_c8.elempack;
            iVar42 = top_blob->elempack;
            uVar30 = (long)(int)(uVar39 * 8) + local_160 * 4;
            uVar50 = (uint)uVar30;
            local_178 = (undefined1 (*) [16])
                        ((int)((long)((ulong)(uint)((int)uVar50 >> 0x1f) << 0x20 |
                                     uVar30 & 0xffffffff) / (long)iVar42) * lVar53 *
                         top_blob->elemsize + (long)top_blob->data);
            uVar49 = uVar50 + 7;
            if (-1 < (int)uVar50) {
              uVar49 = uVar50;
            }
            auVar18._8_8_ = 0;
            auVar18._0_8_ = local_108._8_8_;
            local_108 = auVar18 << 0x40;
            iVar41 = 0;
            lVar28 = 0;
            local_140 = lVar58 * 4;
            do {
              auVar165 = ZEXT1664(ZEXT816(0) << 0x40);
              fVar168 = 0.0;
              fVar170 = 0.0;
              fVar171 = 0.0;
              fVar172 = 0.0;
              if (pvVar8 != (void *)0x0) {
                pfVar48 = (float *)((long)pvVar8 + uVar30 * 4);
                fVar168 = *pfVar48;
                fVar170 = pfVar48[1];
                fVar171 = pfVar48[2];
                fVar172 = pfVar48[3];
              }
              pfVar48 = (float *)((this->weight_data_tm).cstep *
                                  (long)(((int)(uVar50 - (uVar49 & 0xfffffff8)) >> 2) +
                                        ((int)uVar49 >> 3)) * (this->weight_data_tm).elemsize +
                                 (long)(this->weight_data_tm).data);
              if ((int)uVar23 < 8) {
                fVar173 = 0.0;
                fVar174 = 0.0;
                fVar175 = 0.0;
                fVar176 = 0.0;
                fVar65 = 0.0;
                fVar80 = 0.0;
                fVar81 = 0.0;
                fVar82 = 0.0;
                uVar24 = 0;
              }
              else {
                fVar65 = 0.0;
                fVar80 = 0.0;
                fVar81 = 0.0;
                fVar82 = 0.0;
                fVar173 = 0.0;
                fVar174 = 0.0;
                fVar175 = 0.0;
                fVar176 = 0.0;
                iVar40 = 0;
                do {
                  lVar29 = (long)(iVar40 / local_c8.elempack) * (long)local_c8.w * local_c8.elemsize
                  ;
                  if (local_c8.elempack == 8) {
                    if (0 < iVar5) {
                      pfVar52 = (float *)((long)(_func_int ***)local_c8.data +
                                         lVar29 + (long)iVar41 * 4);
                      iVar43 = iVar5;
                      do {
                        fVar83 = *pfVar52;
                        fVar84 = pfVar52[1];
                        fVar85 = pfVar52[2];
                        fVar86 = pfVar52[3];
                        fVar179 = pfVar52[4];
                        fVar168 = fVar179 * pfVar48[0x10] + fVar83 * *pfVar48 + fVar168;
                        fVar170 = fVar179 * pfVar48[0x11] + fVar83 * pfVar48[1] + fVar170;
                        fVar171 = fVar179 * pfVar48[0x12] + fVar83 * pfVar48[2] + fVar171;
                        fVar172 = fVar179 * pfVar48[0x13] + fVar83 * pfVar48[3] + fVar172;
                        fVar83 = pfVar52[5];
                        fVar65 = fVar83 * pfVar48[0x14] + fVar65 + fVar84 * pfVar48[4];
                        fVar80 = fVar83 * pfVar48[0x15] + fVar80 + fVar84 * pfVar48[5];
                        fVar81 = fVar83 * pfVar48[0x16] + fVar81 + fVar84 * pfVar48[6];
                        fVar82 = fVar83 * pfVar48[0x17] + fVar82 + fVar84 * pfVar48[7];
                        fVar83 = pfVar52[6];
                        fVar173 = fVar85 * pfVar48[8] + fVar173 + fVar83 * pfVar48[0x18];
                        fVar174 = fVar85 * pfVar48[9] + fVar174 + fVar83 * pfVar48[0x19];
                        fVar175 = fVar85 * pfVar48[10] + fVar175 + fVar83 * pfVar48[0x1a];
                        fVar176 = fVar85 * pfVar48[0xb] + fVar176 + fVar83 * pfVar48[0x1b];
                        fVar83 = pfVar52[7];
                        auVar165 = ZEXT1664(CONCAT412(fVar86 * pfVar48[0xf] + auVar165._12_4_ +
                                                      fVar83 * pfVar48[0x1f],
                                                      CONCAT48(fVar86 * pfVar48[0xe] +
                                                               auVar165._8_4_ +
                                                               fVar83 * pfVar48[0x1e],
                                                               CONCAT44(fVar86 * pfVar48[0xd] +
                                                                        auVar165._4_4_ +
                                                                        fVar83 * pfVar48[0x1d],
                                                                        fVar86 * pfVar48[0xc] +
                                                                        auVar165._0_4_ +
                                                                        fVar83 * pfVar48[0x1c]))));
                        pfVar48 = pfVar48 + 0x20;
                        pfVar52 = pfVar52 + iVar6 * 8;
                        iVar43 = iVar43 + -1;
                      } while (iVar43 != 0);
                      goto LAB_0053d603;
                    }
                  }
                  else {
                    pfVar52 = (float *)((long)(_func_int ***)local_c8.data +
                                       lVar29 + (long)(local_c8.elempack * iVar47 * (int)lVar28) * 4
                                       );
LAB_0053d603:
                    if (local_c8.elempack == 4) {
                      iVar43 = iVar5;
                      if (iVar5 < 1) goto LAB_0053d764;
                      do {
                        fVar83 = *pfVar52;
                        fVar84 = pfVar52[1];
                        fVar85 = pfVar52[2];
                        fVar86 = pfVar52[3];
                        fVar179 = pfVar52[lVar58];
                        fVar168 = fVar179 * pfVar48[0x10] + fVar83 * *pfVar48 + fVar168;
                        fVar170 = fVar179 * pfVar48[0x11] + fVar83 * pfVar48[1] + fVar170;
                        fVar171 = fVar179 * pfVar48[0x12] + fVar83 * pfVar48[2] + fVar171;
                        fVar172 = fVar179 * pfVar48[0x13] + fVar83 * pfVar48[3] + fVar172;
                        fVar83 = pfVar52[lVar58 + 1];
                        fVar65 = fVar83 * pfVar48[0x14] + fVar65 + fVar84 * pfVar48[4];
                        fVar80 = fVar83 * pfVar48[0x15] + fVar80 + fVar84 * pfVar48[5];
                        fVar81 = fVar83 * pfVar48[0x16] + fVar81 + fVar84 * pfVar48[6];
                        fVar82 = fVar83 * pfVar48[0x17] + fVar82 + fVar84 * pfVar48[7];
                        fVar83 = pfVar52[lVar58 + 2];
                        fVar173 = fVar85 * pfVar48[8] + fVar173 + fVar83 * pfVar48[0x18];
                        fVar174 = fVar85 * pfVar48[9] + fVar174 + fVar83 * pfVar48[0x19];
                        fVar175 = fVar85 * pfVar48[10] + fVar175 + fVar83 * pfVar48[0x1a];
                        fVar176 = fVar85 * pfVar48[0xb] + fVar176 + fVar83 * pfVar48[0x1b];
                        fVar83 = pfVar52[lVar58 + 3];
                        auVar165 = ZEXT1664(CONCAT412(fVar86 * pfVar48[0xf] + auVar165._12_4_ +
                                                      fVar83 * pfVar48[0x1f],
                                                      CONCAT48(fVar86 * pfVar48[0xe] +
                                                               auVar165._8_4_ +
                                                               fVar83 * pfVar48[0x1e],
                                                               CONCAT44(fVar86 * pfVar48[0xd] +
                                                                        auVar165._4_4_ +
                                                                        fVar83 * pfVar48[0x1d],
                                                                        fVar86 * pfVar48[0xc] +
                                                                        auVar165._0_4_ +
                                                                        fVar83 * pfVar48[0x1c]))));
                        pfVar48 = pfVar48 + 0x20;
                        pfVar52 = pfVar52 + iVar6 * 4;
                        iVar43 = iVar43 + -1;
                      } while (iVar43 != 0);
                    }
                    if ((local_c8.elempack == 1) && (iVar43 = iVar5, 0 < iVar5)) {
                      do {
                        fVar83 = *pfVar52;
                        fVar84 = pfVar52[lVar58];
                        fVar85 = pfVar52[iVar22 * 2];
                        fVar86 = pfVar52[iVar22 * 3];
                        fVar179 = pfVar52[iVar22 * 4];
                        fVar168 = fVar179 * pfVar48[0x10] + fVar83 * *pfVar48 + fVar168;
                        fVar170 = fVar179 * pfVar48[0x11] + fVar83 * pfVar48[1] + fVar170;
                        fVar171 = fVar179 * pfVar48[0x12] + fVar83 * pfVar48[2] + fVar171;
                        fVar172 = fVar179 * pfVar48[0x13] + fVar83 * pfVar48[3] + fVar172;
                        fVar83 = pfVar52[iVar22 * 5];
                        fVar65 = fVar83 * pfVar48[0x14] + fVar65 + fVar84 * pfVar48[4];
                        fVar80 = fVar83 * pfVar48[0x15] + fVar80 + fVar84 * pfVar48[5];
                        fVar81 = fVar83 * pfVar48[0x16] + fVar81 + fVar84 * pfVar48[6];
                        fVar82 = fVar83 * pfVar48[0x17] + fVar82 + fVar84 * pfVar48[7];
                        fVar83 = pfVar52[iVar22 * 6];
                        fVar173 = fVar85 * pfVar48[8] + fVar173 + fVar83 * pfVar48[0x18];
                        fVar174 = fVar85 * pfVar48[9] + fVar174 + fVar83 * pfVar48[0x19];
                        fVar175 = fVar85 * pfVar48[10] + fVar175 + fVar83 * pfVar48[0x1a];
                        fVar176 = fVar85 * pfVar48[0xb] + fVar176 + fVar83 * pfVar48[0x1b];
                        fVar83 = pfVar52[iVar22 * 7];
                        auVar165 = ZEXT1664(CONCAT412(fVar86 * pfVar48[0xf] + auVar165._12_4_ +
                                                      fVar83 * pfVar48[0x1f],
                                                      CONCAT48(fVar86 * pfVar48[0xe] +
                                                               auVar165._8_4_ +
                                                               fVar83 * pfVar48[0x1e],
                                                               CONCAT44(fVar86 * pfVar48[0xd] +
                                                                        auVar165._4_4_ +
                                                                        fVar83 * pfVar48[0x1d],
                                                                        fVar86 * pfVar48[0xc] +
                                                                        auVar165._0_4_ +
                                                                        fVar83 * pfVar48[0x1c]))));
                        pfVar48 = pfVar48 + 0x20;
                        pfVar52 = pfVar52 + lVar26;
                        iVar43 = iVar43 + -1;
                      } while (iVar43 != 0);
                    }
                  }
LAB_0053d764:
                  iVar43 = iVar40 + 0xf;
                  uVar24 = uVar23 & 0xfffffff8;
                  iVar40 = iVar40 + 8;
                } while (iVar43 < (int)uVar23);
              }
              auVar117 = auVar165._0_16_;
              if ((int)(uVar24 | 3) < (int)uVar23) {
                uVar51 = uVar24;
                do {
                  lVar29 = (long)((int)uVar51 / local_c8.elempack) *
                           (long)local_c8.w * local_c8.elemsize;
                  if (local_c8.elempack == 4) {
                    if (0 < iVar5) {
                      pfVar52 = (float *)((long)(_func_int ***)local_c8.data +
                                         lVar29 + (long)iVar41 * 4);
                      iVar40 = iVar5;
                      do {
                        fVar83 = *pfVar52;
                        fVar168 = fVar83 * *pfVar48 + fVar168;
                        fVar170 = fVar83 * pfVar48[1] + fVar170;
                        fVar171 = fVar83 * pfVar48[2] + fVar171;
                        fVar172 = fVar83 * pfVar48[3] + fVar172;
                        fVar83 = pfVar52[1];
                        fVar65 = fVar65 + fVar83 * pfVar48[4];
                        fVar80 = fVar80 + fVar83 * pfVar48[5];
                        fVar81 = fVar81 + fVar83 * pfVar48[6];
                        fVar82 = fVar82 + fVar83 * pfVar48[7];
                        fVar83 = pfVar52[2];
                        fVar173 = fVar173 + fVar83 * pfVar48[8];
                        fVar174 = fVar174 + fVar83 * pfVar48[9];
                        fVar175 = fVar175 + fVar83 * pfVar48[10];
                        fVar176 = fVar176 + fVar83 * pfVar48[0xb];
                        fVar83 = pfVar52[3];
                        auVar165 = ZEXT1664(CONCAT412(fVar83 * pfVar48[0xf] + auVar165._12_4_,
                                                      CONCAT48(fVar83 * pfVar48[0xe] +
                                                               auVar165._8_4_,
                                                               CONCAT44(fVar83 * pfVar48[0xd] +
                                                                        auVar165._4_4_,
                                                                        fVar83 * pfVar48[0xc] +
                                                                        auVar165._0_4_))));
                        pfVar48 = pfVar48 + 0x10;
                        pfVar52 = pfVar52 + iVar6 * 4;
                        iVar40 = iVar40 + -1;
                      } while (iVar40 != 0);
                      goto LAB_0053d842;
                    }
                  }
                  else {
                    pfVar52 = (float *)((long)(_func_int ***)local_c8.data +
                                       lVar29 + (long)(local_c8.elempack * iVar47 * (int)lVar28) * 4
                                       );
LAB_0053d842:
                    if ((local_c8.elempack == 1) && (iVar40 = iVar5, 0 < iVar5)) {
                      do {
                        fVar83 = *pfVar52;
                        fVar168 = fVar83 * *pfVar48 + fVar168;
                        fVar170 = fVar83 * pfVar48[1] + fVar170;
                        fVar171 = fVar83 * pfVar48[2] + fVar171;
                        fVar172 = fVar83 * pfVar48[3] + fVar172;
                        fVar83 = pfVar52[lVar58];
                        fVar65 = fVar65 + fVar83 * pfVar48[4];
                        fVar80 = fVar80 + fVar83 * pfVar48[5];
                        fVar81 = fVar81 + fVar83 * pfVar48[6];
                        fVar82 = fVar82 + fVar83 * pfVar48[7];
                        fVar83 = pfVar52[iVar22 * 2];
                        fVar173 = fVar173 + fVar83 * pfVar48[8];
                        fVar174 = fVar174 + fVar83 * pfVar48[9];
                        fVar175 = fVar175 + fVar83 * pfVar48[10];
                        fVar176 = fVar176 + fVar83 * pfVar48[0xb];
                        fVar83 = pfVar52[iVar22 * 3];
                        auVar165 = ZEXT1664(CONCAT412(fVar83 * pfVar48[0xf] + auVar165._12_4_,
                                                      CONCAT48(fVar83 * pfVar48[0xe] +
                                                               auVar165._8_4_,
                                                               CONCAT44(fVar83 * pfVar48[0xd] +
                                                                        auVar165._4_4_,
                                                                        fVar83 * pfVar48[0xc] +
                                                                        auVar165._0_4_))));
                        pfVar48 = pfVar48 + 0x10;
                        pfVar52 = pfVar52 + lVar26;
                        iVar40 = iVar40 + -1;
                      } while (iVar40 != 0);
                    }
                  }
                  auVar117 = auVar165._0_16_;
                  uVar24 = uVar51 + 4;
                  iVar40 = uVar51 + 7;
                  uVar51 = uVar24;
                } while (iVar40 < (int)uVar23);
              }
              uVar31 = (ulong)uVar24;
              if ((int)(uVar24 | 1) < (int)uVar23) {
                lVar36 = (long)local_c8.w * local_c8.elemsize * uVar31;
                lVar57 = (long)(_func_int ***)local_c8.data + lVar36 + local_140;
                lVar29 = (long)local_c8.w * local_c8.elemsize * 2;
                lVar36 = (long)(_func_int ***)local_c8.data + lVar36 + local_108._0_8_;
                do {
                  if (0 < iVar5) {
                    lVar37 = 0;
                    iVar40 = iVar5;
                    do {
                      fVar83 = *(float *)(lVar36 + lVar37);
                      fVar168 = fVar83 * *pfVar48 + fVar168;
                      fVar170 = fVar83 * pfVar48[1] + fVar170;
                      fVar171 = fVar83 * pfVar48[2] + fVar171;
                      fVar172 = fVar83 * pfVar48[3] + fVar172;
                      fVar83 = *(float *)(lVar57 + lVar37);
                      fVar65 = fVar65 + fVar83 * pfVar48[4];
                      fVar80 = fVar80 + fVar83 * pfVar48[5];
                      fVar81 = fVar81 + fVar83 * pfVar48[6];
                      fVar82 = fVar82 + fVar83 * pfVar48[7];
                      pfVar48 = pfVar48 + 8;
                      lVar37 = lVar37 + lVar26 * 4;
                      iVar40 = iVar40 + -1;
                    } while (iVar40 != 0);
                  }
                  uVar31 = uVar31 + 2;
                  uVar24 = (uint)uVar31;
                  lVar57 = lVar57 + lVar29;
                  lVar36 = lVar36 + lVar29;
                } while ((int)(uVar24 | 1) < (int)uVar23);
              }
              if ((int)uVar24 < (int)uVar23) {
                uVar31 = (ulong)uVar24;
                pfVar52 = (float *)((long)(_func_int ***)local_c8.data +
                                   (long)local_c8.w * local_c8.elemsize * uVar31 + local_108._0_8_);
                do {
                  pfVar33 = pfVar52;
                  iVar40 = iVar5;
                  if (0 < iVar5) {
                    do {
                      fVar83 = *pfVar33;
                      fVar168 = fVar83 * *pfVar48 + fVar168;
                      fVar170 = fVar83 * pfVar48[1] + fVar170;
                      fVar171 = fVar83 * pfVar48[2] + fVar171;
                      fVar172 = fVar83 * pfVar48[3] + fVar172;
                      pfVar48 = pfVar48 + 4;
                      pfVar33 = pfVar33 + lVar26;
                      iVar40 = iVar40 + -1;
                    } while (iVar40 != 0);
                  }
                  uVar31 = uVar31 + 1;
                  pfVar52 = (float *)((long)pfVar52 + (long)local_c8.w * local_c8.elemsize);
                } while ((int)uVar31 < (int)uVar23);
              }
              auVar66._0_4_ = fVar173 + auVar117._0_4_ + fVar65 + fVar168;
              auVar66._4_4_ = fVar174 + auVar117._4_4_ + fVar80 + fVar170;
              auVar66._8_4_ = fVar175 + auVar117._8_4_ + fVar81 + fVar171;
              auVar66._12_4_ = fVar176 + auVar117._12_4_ + fVar82 + fVar172;
              fVar168 = auVar148._0_4_;
              fVar170 = auVar148._4_4_;
              fVar171 = auVar148._8_4_;
              fVar172 = auVar148._12_4_;
              switch(uVar35) {
              case 1:
                auVar66 = vmaxps_avx(auVar66,_DAT_005a40d0);
                break;
              case 2:
                auVar117 = vmaxps_avx(auVar66,ZEXT816(0) << 0x40);
                auVar149 = vminps_avx(auVar66,ZEXT816(0) << 0x40);
                fVar168 = *(this->super_Convolution1D).activation_params.data;
                auVar66._0_4_ = fVar168 * auVar149._0_4_ + auVar117._0_4_;
                auVar66._4_4_ = fVar168 * auVar149._4_4_ + auVar117._4_4_;
                auVar66._8_4_ = fVar168 * auVar149._8_4_ + auVar117._8_4_;
                auVar66._12_4_ = fVar168 * auVar149._12_4_ + auVar117._12_4_;
                break;
              case 3:
                puVar54 = (undefined4 *)(this->super_Convolution1D).activation_params.data;
                uVar7 = *puVar54;
                auVar92._4_4_ = uVar7;
                auVar92._0_4_ = uVar7;
                auVar92._8_4_ = uVar7;
                auVar92._12_4_ = uVar7;
                uVar7 = puVar54[1];
                auVar160._4_4_ = uVar7;
                auVar160._0_4_ = uVar7;
                auVar160._8_4_ = uVar7;
                auVar160._12_4_ = uVar7;
                auVar117 = vmaxps_avx(auVar66,auVar92);
                auVar66 = vminps_avx(auVar117,auVar160);
                break;
              case 4:
                uVar31 = CONCAT44(auVar66._4_4_,auVar66._0_4_);
                auVar67._0_8_ = uVar31 ^ 0x8000000080000000;
                auVar67._8_4_ = -auVar66._8_4_;
                auVar67._12_4_ = -auVar66._12_4_;
                auVar93._8_4_ = 0x42b0c0a5;
                auVar93._0_8_ = 0x42b0c0a542b0c0a5;
                auVar93._12_4_ = 0x42b0c0a5;
                auVar117 = vminps_avx(auVar67,auVar93);
                auVar94._8_4_ = 0xc2b0c0a5;
                auVar94._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar94._12_4_ = 0xc2b0c0a5;
                auVar116 = vmaxps_avx(auVar117,auVar94);
                auVar95._0_4_ = fVar168 + auVar116._0_4_ * 1.442695;
                auVar95._4_4_ = fVar170 + auVar116._4_4_ * 1.442695;
                auVar95._8_4_ = fVar171 + auVar116._8_4_ * 1.442695;
                auVar95._12_4_ = fVar172 + auVar116._12_4_ * 1.442695;
                auVar161._0_4_ = (int)auVar95._0_4_;
                auVar161._4_4_ = (int)auVar95._4_4_;
                auVar161._8_4_ = (int)auVar95._8_4_;
                auVar161._12_4_ = (int)auVar95._12_4_;
                auVar149 = vcvtdq2ps_avx(auVar161);
                auVar117 = vcmpps_avx(auVar95,auVar149,1);
                auVar117 = vandps_avx(auVar117,auVar150);
                auVar117 = vsubps_avx(auVar149,auVar117);
                fVar173 = auVar116._0_4_ + auVar117._0_4_ * -0.6931472;
                fVar174 = auVar116._4_4_ + auVar117._4_4_ * -0.6931472;
                fVar175 = auVar116._8_4_ + auVar117._8_4_ * -0.6931472;
                fVar176 = auVar116._12_4_ + auVar117._12_4_ * -0.6931472;
                auVar96._0_4_ = (int)auVar117._0_4_;
                auVar96._4_4_ = (int)auVar117._4_4_;
                auVar96._8_4_ = (int)auVar117._8_4_;
                auVar96._12_4_ = (int)auVar117._12_4_;
                auVar117 = vpslld_avx(auVar96,0x17);
                auVar117 = vpaddd_avx(auVar117,auVar150);
                auVar68._0_4_ =
                     (fVar173 + 1.0 +
                     (((((fVar173 * 0.00019875691 + 0.0013981999) * fVar173 + 0.008333452) * fVar173
                       + 0.041665796) * fVar173 + 0.16666666) * fVar173 + fVar168) *
                     fVar173 * fVar173) * auVar117._0_4_ + 1.0;
                auVar68._4_4_ =
                     (fVar174 + 1.0 +
                     (((((fVar174 * 0.00019875691 + 0.0013981999) * fVar174 + 0.008333452) * fVar174
                       + 0.041665796) * fVar174 + 0.16666666) * fVar174 + fVar170) *
                     fVar174 * fVar174) * auVar117._4_4_ + 1.0;
                auVar68._8_4_ =
                     (fVar175 + 1.0 +
                     (((((fVar175 * 0.00019875691 + 0.0013981999) * fVar175 + 0.008333452) * fVar175
                       + 0.041665796) * fVar175 + 0.16666666) * fVar175 + fVar171) *
                     fVar175 * fVar175) * auVar117._8_4_ + 1.0;
                auVar68._12_4_ =
                     (fVar176 + 1.0 +
                     (((((fVar176 * 0.00019875691 + 0.0013981999) * fVar176 + 0.008333452) * fVar176
                       + 0.041665796) * fVar176 + 0.16666666) * fVar176 + fVar172) *
                     fVar176 * fVar176) * auVar117._12_4_ + 1.0;
                auVar66 = vdivps_avx(auVar150,auVar68);
                break;
              case 5:
                auVar145._8_4_ = 0x42b0c0a5;
                auVar145._0_8_ = 0x42b0c0a542b0c0a5;
                auVar145._12_4_ = 0x42b0c0a5;
                auVar117 = vminps_avx(auVar66,auVar145);
                auVar163._8_4_ = 0xc2b0c0a5;
                auVar163._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar163._12_4_ = 0xc2b0c0a5;
                auVar116 = vmaxps_avx(auVar163,auVar117);
                auVar155._0_4_ = fVar168 + auVar116._0_4_ * 1.442695;
                auVar155._4_4_ = fVar170 + auVar116._4_4_ * 1.442695;
                auVar155._8_4_ = fVar171 + auVar116._8_4_ * 1.442695;
                auVar155._12_4_ = fVar172 + auVar116._12_4_ * 1.442695;
                auVar177._0_4_ = (int)auVar155._0_4_;
                auVar177._4_4_ = (int)auVar155._4_4_;
                auVar177._8_4_ = (int)auVar155._8_4_;
                auVar177._12_4_ = (int)auVar155._12_4_;
                auVar149 = vcvtdq2ps_avx(auVar177);
                auVar117 = vcmpps_avx(auVar155,auVar149,1);
                auVar117 = vandps_avx(auVar117,auVar150);
                auVar117 = vsubps_avx(auVar149,auVar117);
                auVar178._0_4_ = auVar117._0_4_ * 0.6931472;
                auVar178._4_4_ = auVar117._4_4_ * 0.6931472;
                auVar178._8_4_ = auVar117._8_4_ * 0.6931472;
                auVar178._12_4_ = auVar117._12_4_ * 0.6931472;
                auVar149 = vsubps_avx(auVar116,auVar178);
                fVar173 = auVar149._0_4_;
                fVar174 = auVar149._4_4_;
                fVar175 = auVar149._8_4_;
                fVar176 = auVar149._12_4_;
                auVar156._0_4_ = (int)auVar117._0_4_;
                auVar156._4_4_ = (int)auVar117._4_4_;
                auVar156._8_4_ = (int)auVar117._8_4_;
                auVar156._12_4_ = (int)auVar117._12_4_;
                auVar117 = vpslld_avx(auVar156,0x17);
                auVar117 = vpaddd_avx(auVar117,auVar150);
                auVar157._0_4_ =
                     (fVar173 * fVar173 *
                      (((((fVar173 * 0.00019875691 + 0.0013981999) * fVar173 + 0.008333452) *
                         fVar173 + 0.041665796) * fVar173 + 0.16666666) * fVar173 + fVar168) +
                     fVar173 + 1.0) * auVar117._0_4_ + 1.0;
                auVar157._4_4_ =
                     (fVar174 * fVar174 *
                      (((((fVar174 * 0.00019875691 + 0.0013981999) * fVar174 + 0.008333452) *
                         fVar174 + 0.041665796) * fVar174 + 0.16666666) * fVar174 + fVar170) +
                     fVar174 + 1.0) * auVar117._4_4_ + 1.0;
                auVar157._8_4_ =
                     (fVar175 * fVar175 *
                      (((((fVar175 * 0.00019875691 + 0.0013981999) * fVar175 + 0.008333452) *
                         fVar175 + 0.041665796) * fVar175 + 0.16666666) * fVar175 + fVar171) +
                     fVar175 + 1.0) * auVar117._8_4_ + 1.0;
                auVar157._12_4_ =
                     (fVar176 * fVar176 *
                      (((((fVar176 * 0.00019875691 + 0.0013981999) * fVar176 + 0.008333452) *
                         fVar176 + 0.041665796) * fVar176 + 0.16666666) * fVar176 + fVar172) +
                     fVar176 + 1.0) * auVar117._12_4_ + 1.0;
                auVar88._8_4_ = 0x800000;
                auVar88._0_8_ = 0x80000000800000;
                auVar88._12_4_ = 0x800000;
                auVar117 = vmaxps_avx(auVar157,auVar88);
                auVar149 = vpsrld_avx(auVar117,0x17);
                auVar119._8_4_ = 0xffffff82;
                auVar119._0_8_ = 0xffffff82ffffff82;
                auVar119._12_4_ = 0xffffff82;
                auVar149 = vpaddd_avx(auVar149,auVar119);
                auVar120._8_4_ = 0x807fffff;
                auVar120._0_8_ = 0x807fffff807fffff;
                auVar120._12_4_ = 0x807fffff;
                auVar117 = vandps_avx(auVar117,auVar120);
                auVar118 = vorps_avx(auVar117,auVar148._0_16_);
                auVar116 = vcvtdq2ps_avx(auVar149);
                auVar121._8_4_ = 0x3f3504f3;
                auVar121._0_8_ = 0x3f3504f33f3504f3;
                auVar121._12_4_ = 0x3f3504f3;
                auVar149 = vcmpps_avx(auVar118,auVar121,1);
                auVar117 = vandps_avx(auVar149,auVar118);
                fVar173 = auVar118._0_4_ + -1.0 + auVar117._0_4_;
                fVar174 = auVar118._4_4_ + -1.0 + auVar117._4_4_;
                fVar175 = auVar118._8_4_ + -1.0 + auVar117._8_4_;
                fVar176 = auVar118._12_4_ + -1.0 + auVar117._12_4_;
                auVar117 = vandps_avx(auVar149,auVar150);
                auVar149 = vsubps_avx(auVar116,auVar117);
                auVar117 = vcmpps_avx(auVar157,_DAT_005a40d0,2);
                auVar89._0_4_ =
                     (fVar173 * fVar173 *
                      (((((((((fVar173 * 0.070376836 + -0.1151461) * fVar173 + 0.116769984) *
                             fVar173 + -0.12420141) * fVar173 + 0.14249323) * fVar173 + -0.16668057)
                          * fVar173 + 0.20000714) * fVar173 + -0.24999994) * fVar173 + 0.3333333) *
                       fVar173 + -0.5) + auVar149._0_4_ * 0.6931472 + fVar173) * -2.0;
                auVar89._4_4_ =
                     (fVar174 * fVar174 *
                      (((((((((fVar174 * 0.070376836 + -0.1151461) * fVar174 + 0.116769984) *
                             fVar174 + -0.12420141) * fVar174 + 0.14249323) * fVar174 + -0.16668057)
                          * fVar174 + 0.20000714) * fVar174 + -0.24999994) * fVar174 + 0.3333333) *
                       fVar174 + -0.5) + auVar149._4_4_ * 0.6931472 + fVar174) * -2.0;
                auVar89._8_4_ =
                     (fVar175 * fVar175 *
                      (((((((((fVar175 * 0.070376836 + -0.1151461) * fVar175 + 0.116769984) *
                             fVar175 + -0.12420141) * fVar175 + 0.14249323) * fVar175 + -0.16668057)
                          * fVar175 + 0.20000714) * fVar175 + -0.24999994) * fVar175 + 0.3333333) *
                       fVar175 + -0.5) + auVar149._8_4_ * 0.6931472 + fVar175) * -2.0;
                auVar89._12_4_ =
                     (fVar176 * fVar176 *
                      (((((((((fVar176 * 0.070376836 + -0.1151461) * fVar176 + 0.116769984) *
                             fVar176 + -0.12420141) * fVar176 + 0.14249323) * fVar176 + -0.16668057)
                          * fVar176 + 0.20000714) * fVar176 + -0.24999994) * fVar176 + 0.3333333) *
                       fVar176 + -0.5) + auVar149._12_4_ * 0.6931472 + fVar176) * -2.0;
                auVar122._8_4_ = 0x7fffffff;
                auVar122._0_8_ = 0x7fffffff7fffffff;
                auVar122._12_4_ = 0x7fffffff;
                auVar117 = vblendvps_avx(auVar89,auVar122,auVar117);
                auVar123._8_4_ = 0x42b0c0a5;
                auVar123._0_8_ = 0x42b0c0a542b0c0a5;
                auVar123._12_4_ = 0x42b0c0a5;
                auVar117 = vminps_avx(auVar117,auVar123);
                auVar124._8_4_ = 0xc2b0c0a5;
                auVar124._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar124._12_4_ = 0xc2b0c0a5;
                auVar116 = vmaxps_avx(auVar117,auVar124);
                auVar125._0_4_ = auVar116._0_4_ * 1.442695 + fVar168;
                auVar125._4_4_ = auVar116._4_4_ * 1.442695 + fVar170;
                auVar125._8_4_ = auVar116._8_4_ * 1.442695 + fVar171;
                auVar125._12_4_ = auVar116._12_4_ * 1.442695 + fVar172;
                auVar158._0_4_ = (int)auVar125._0_4_;
                auVar158._4_4_ = (int)auVar125._4_4_;
                auVar158._8_4_ = (int)auVar125._8_4_;
                auVar158._12_4_ = (int)auVar125._12_4_;
                auVar149 = vcvtdq2ps_avx(auVar158);
                auVar117 = vcmpps_avx(auVar125,auVar149,1);
                auVar117 = vandps_avx(auVar117,auVar150);
                auVar117 = vsubps_avx(auVar149,auVar117);
                auVar159._0_4_ = auVar117._0_4_ * 0.6931472;
                auVar159._4_4_ = auVar117._4_4_ * 0.6931472;
                auVar159._8_4_ = auVar117._8_4_ * 0.6931472;
                auVar159._12_4_ = auVar117._12_4_ * 0.6931472;
                auVar149 = vsubps_avx(auVar116,auVar159);
                fVar173 = auVar149._0_4_;
                fVar174 = auVar149._4_4_;
                fVar175 = auVar149._8_4_;
                fVar176 = auVar149._12_4_;
                auVar148 = ZEXT1664(auVar148._0_16_);
                in_ZMM4 = ZEXT1664(CONCAT412(0x3e2aaaaa,CONCAT48(0x3e2aaaaa,0x3e2aaaaa3e2aaaaa)));
                auVar126._0_4_ = (int)auVar117._0_4_;
                auVar126._4_4_ = (int)auVar117._4_4_;
                auVar126._8_4_ = (int)auVar117._8_4_;
                auVar126._12_4_ = (int)auVar117._12_4_;
                auVar117 = vpslld_avx(auVar126,0x17);
                auVar117 = vpaddd_avx(auVar117,auVar150);
                auVar90._0_4_ =
                     (fVar173 + 1.0 +
                     (((((fVar173 * 0.00019875691 + 0.0013981999) * fVar173 + 0.008333452) * fVar173
                       + 0.041665796) * fVar173 + 0.16666666) * fVar173 + fVar168) *
                     fVar173 * fVar173) * auVar117._0_4_ + 1.0;
                auVar90._4_4_ =
                     (fVar174 + 1.0 +
                     (((((fVar174 * 0.00019875691 + 0.0013981999) * fVar174 + 0.008333452) * fVar174
                       + 0.041665796) * fVar174 + 0.16666666) * fVar174 + fVar170) *
                     fVar174 * fVar174) * auVar117._4_4_ + 1.0;
                auVar90._8_4_ =
                     (fVar175 + 1.0 +
                     (((((fVar175 * 0.00019875691 + 0.0013981999) * fVar175 + 0.008333452) * fVar175
                       + 0.041665796) * fVar175 + 0.16666666) * fVar175 + fVar171) *
                     fVar175 * fVar175) * auVar117._8_4_ + 1.0;
                auVar90._12_4_ =
                     (fVar176 + 1.0 +
                     (((((fVar176 * 0.00019875691 + 0.0013981999) * fVar176 + 0.008333452) * fVar176
                       + 0.041665796) * fVar176 + 0.16666666) * fVar176 + fVar172) *
                     fVar176 * fVar176) * auVar117._12_4_ + 1.0;
                auVar127._8_4_ = 0x40000000;
                auVar127._0_8_ = 0x4000000040000000;
                auVar127._12_4_ = 0x40000000;
                auVar117 = vdivps_avx(auVar127,auVar90);
                auVar91._0_4_ = auVar117._0_4_ + -1.0;
                auVar91._4_4_ = auVar117._4_4_ + -1.0;
                auVar91._8_4_ = auVar117._8_4_ + -1.0;
                auVar91._12_4_ = auVar117._12_4_ + -1.0;
                goto LAB_0053de01;
              case 6:
                pfVar48 = (float *)(this->super_Convolution1D).activation_params.data;
                fVar168 = *pfVar48;
                fVar170 = pfVar48[1];
                auVar97._0_4_ = fVar168 * auVar66._0_4_ + fVar170;
                auVar97._4_4_ = fVar168 * auVar66._4_4_ + fVar170;
                auVar97._8_4_ = fVar168 * auVar66._8_4_ + fVar170;
                auVar97._12_4_ = fVar168 * auVar66._12_4_ + fVar170;
                auVar117 = vmaxps_avx(auVar97,_DAT_005a40d0);
                auVar91 = vminps_avx(auVar117,auVar150);
LAB_0053de01:
                auVar66._0_4_ = auVar91._0_4_ * auVar66._0_4_;
                auVar66._4_4_ = auVar91._4_4_ * auVar66._4_4_;
                auVar66._8_4_ = auVar91._8_4_ * auVar66._8_4_;
                auVar66._12_4_ = auVar91._12_4_ * auVar66._12_4_;
              }
              if (iVar42 == 1) {
                *(int *)*local_178 = auVar66._0_4_;
                uVar7 = vextractps_avx(auVar66,1);
                *(undefined4 *)((long)*local_178 + (long)iVar55 * 4) = uVar7;
                uVar7 = vextractps_avx(auVar66,2);
                *(undefined4 *)((long)*local_178 + (long)(iVar55 * 2) * 4) = uVar7;
                uVar7 = vextractps_avx(auVar66,3);
                *(undefined4 *)((long)*local_178 + (long)(iVar55 * 3) * 4) = uVar7;
                local_178 = (undefined1 (*) [16])((long)*local_178 + 4);
              }
              else if (iVar42 == 4) {
                *local_178 = auVar66;
                local_178 = local_178 + 1;
              }
              lVar28 = lVar28 + 1;
              iVar41 = iVar41 + iVar47 * local_c8.elempack;
              local_140 = local_140 + lVar27 * 4;
              local_108._0_8_ = local_108._0_8_ + lVar27 * 4;
            } while (lVar28 != lVar53);
          }
          local_160 = local_160 + 1;
        } while (local_160 != (uint)(iVar44 >> 2));
      }
      uVar35 = uVar39 * 8 + (iVar44 >> 2) * 4;
      local_60 = (ulong)uVar35;
      uVar30 = (ulong)(uint)((int)(iVar25 - uVar35) / 2);
      local_68 = uVar30;
      if (1 < (int)(iVar25 - uVar35)) {
        uVar49 = local_c8.h * local_c8.elempack;
        uVar39 = top_blob->w;
        local_70 = (long)(int)uVar39 * top_blob->elemsize;
        sVar9 = (this->weight_data_tm).elemsize;
        sVar10 = (this->weight_data_tm).cstep;
        iVar25 = local_c8.elempack * iVar47;
        bVar59 = local_c8.elempack == 1;
        local_f0 = uVar49 & 0xfffffff8;
        iVar55 = local_c8.elempack * iVar47;
        local_38 = top_blob->data;
        local_40 = (this->weight_data_tm).data;
        local_48 = (long)(int)uVar35;
        local_50 = lVar58 * 4;
        local_170 = 0;
        do {
          pvVar11 = local_c8.data;
          if (0 < (int)uVar39) {
            lVar53 = local_48 + local_170 * 2;
            puVar54 = (undefined4 *)((local_48 + local_170 * 2 + 1) * local_70 + (long)local_38);
            puVar56 = (undefined4 *)(lVar53 * local_70 + (long)local_38);
            uVar35 = (uint)lVar53;
            uVar50 = uVar35 + 3;
            uVar23 = uVar35 + 7;
            if (-1 < (int)uVar35) {
              uVar50 = uVar35;
              uVar23 = uVar35;
            }
            cVar20 = (char)lVar53 - ((byte)uVar23 & 0xf8);
            pfVar52 = (float *)((long)(((int)(uVar35 - (uVar50 & 0xfffffffc)) >> 1) +
                                       ((int)uVar23 >> 3) +
                                      (int)((char)(((byte)(cVar20 >> 7) >> 6) + cVar20) >> 2)) *
                                sVar9 * sVar10 + (long)local_40);
            lVar28 = (long)local_c8.w * local_c8.elemsize;
            pfVar48 = (float *)(this->super_Convolution1D).activation_params.data;
            local_148 = (long)(_func_int ***)local_c8.data + local_50;
            iVar44 = 0;
            local_1d0 = (Allocator *)local_c8.data;
            local_1f0 = 0;
            do {
              if (pvVar8 == (void *)0x0) {
                fVar168 = 0.0;
                fVar170 = 0.0;
              }
              else {
                pfVar33 = (float *)((long)pvVar8 + lVar53 * 4);
                fVar168 = *pfVar33;
                fVar170 = pfVar33[1];
              }
              pfVar33 = pfVar52;
              if ((int)uVar49 < 8) {
                fVar81 = 0.0;
                fVar82 = 0.0;
                fVar83 = 0.0;
                fVar84 = 0.0;
                fVar85 = 0.0;
                fVar86 = 0.0;
                fVar179 = 0.0;
                fVar180 = 0.0;
                fVar171 = 0.0;
                fVar172 = 0.0;
                fVar173 = 0.0;
                fVar174 = 0.0;
                fVar175 = 0.0;
                fVar176 = 0.0;
                fVar65 = 0.0;
                fVar80 = 0.0;
                uVar35 = 0;
              }
              else {
                fVar171 = 0.0;
                fVar172 = 0.0;
                fVar173 = 0.0;
                fVar174 = 0.0;
                fVar175 = 0.0;
                fVar176 = 0.0;
                fVar65 = 0.0;
                fVar80 = 0.0;
                fVar81 = 0.0;
                fVar82 = 0.0;
                fVar83 = 0.0;
                fVar84 = 0.0;
                fVar85 = 0.0;
                fVar86 = 0.0;
                fVar179 = 0.0;
                fVar180 = 0.0;
                iVar42 = 0;
                do {
                  lVar29 = (iVar42 / iVar4) * lVar28;
                  if (iVar4 == 8) {
                    if (0 < iVar5) {
                      pfVar32 = (float *)((long)(_func_int ***)pvVar11 + lVar29 + (long)iVar44 * 4);
                      auVar148 = in_ZMM4;
                      iVar41 = iVar5;
                      do {
                        auVar165._0_4_ = *pfVar32 * *pfVar33;
                        auVar165._4_4_ = pfVar32[1] * pfVar33[1];
                        auVar165._8_4_ = pfVar32[2] * pfVar33[2];
                        auVar165._12_4_ = pfVar32[3] * pfVar33[3];
                        auVar165._16_4_ = pfVar32[4] * pfVar33[4];
                        auVar165._20_4_ = pfVar32[5] * pfVar33[5];
                        auVar165._28_36_ = auVar148._28_36_;
                        auVar165._24_4_ = pfVar32[6] * pfVar33[6];
                        in_ZMM4 = ZEXT3264(auVar165._0_32_);
                        fVar81 = auVar165._0_4_ + fVar81;
                        fVar82 = auVar165._4_4_ + fVar82;
                        fVar83 = auVar165._8_4_ + fVar83;
                        fVar84 = auVar165._12_4_ + fVar84;
                        fVar85 = auVar165._16_4_ + fVar85;
                        fVar86 = auVar165._20_4_ + fVar86;
                        fVar179 = auVar165._24_4_ + fVar179;
                        fVar180 = auVar148._28_4_ + fVar180;
                        fVar171 = *pfVar32 * pfVar33[8] + fVar171;
                        fVar172 = pfVar32[1] * pfVar33[9] + fVar172;
                        fVar173 = pfVar32[2] * pfVar33[10] + fVar173;
                        fVar174 = pfVar32[3] * pfVar33[0xb] + fVar174;
                        fVar175 = pfVar32[4] * pfVar33[0xc] + fVar175;
                        fVar176 = pfVar32[5] * pfVar33[0xd] + fVar176;
                        fVar65 = pfVar32[6] * pfVar33[0xe] + fVar65;
                        fVar80 = pfVar32[7] + fVar80;
                        pfVar33 = pfVar33 + 0x10;
                        pfVar32 = pfVar32 + iVar6 * 8;
                        iVar41 = iVar41 + -1;
                        auVar148 = in_ZMM4;
                      } while (iVar41 != 0);
                      goto LAB_0053e298;
                    }
                  }
                  else {
                    pfVar32 = (float *)((long)(_func_int ***)pvVar11 +
                                       lVar29 + (long)(iVar25 * (int)local_1f0) * 4);
LAB_0053e298:
                    if (iVar4 == 4) {
                      iVar41 = iVar5;
                      if (iVar5 < 1) goto LAB_0053e367;
                      do {
                        auVar148._0_4_ = *pfVar32 * *pfVar33;
                        auVar148._4_4_ = pfVar32[1] * pfVar33[1];
                        auVar148._8_4_ = pfVar32[2] * pfVar33[2];
                        auVar148._12_4_ = pfVar32[3] * pfVar33[3];
                        auVar148._16_4_ = pfVar32[lVar58 + 4] * pfVar33[4];
                        auVar148._20_4_ = pfVar32[lVar58 + 5] * pfVar33[5];
                        auVar148._28_36_ = in_ZMM4._28_36_;
                        auVar148._24_4_ = pfVar32[lVar58 + 6] * pfVar33[6];
                        fVar81 = auVar148._0_4_ + fVar81;
                        fVar82 = auVar148._4_4_ + fVar82;
                        fVar83 = auVar148._8_4_ + fVar83;
                        fVar84 = auVar148._12_4_ + fVar84;
                        fVar85 = auVar148._16_4_ + fVar85;
                        fVar86 = auVar148._20_4_ + fVar86;
                        fVar179 = auVar148._24_4_ + fVar179;
                        fVar180 = in_ZMM4._28_4_ + fVar180;
                        fVar171 = *pfVar32 * pfVar33[8] + fVar171;
                        fVar172 = pfVar32[1] * pfVar33[9] + fVar172;
                        fVar173 = pfVar32[2] * pfVar33[10] + fVar173;
                        fVar174 = pfVar32[3] * pfVar33[0xb] + fVar174;
                        fVar175 = pfVar32[lVar58 + 4] * pfVar33[0xc] + fVar175;
                        fVar176 = pfVar32[lVar58 + 5] * pfVar33[0xd] + fVar176;
                        fVar65 = pfVar32[lVar58 + 6] * pfVar33[0xe] + fVar65;
                        fVar80 = pfVar32[lVar58 + 7] + fVar80;
                        pfVar33 = pfVar33 + 0x10;
                        pfVar32 = pfVar32 + iVar6 * 4;
                        iVar41 = iVar41 + -1;
                        in_ZMM4 = ZEXT3264(auVar148._0_32_);
                      } while (iVar41 != 0);
                    }
                    iVar41 = iVar5;
                    if (0 < iVar5 && bVar59) {
                      do {
                        auVar117 = vinsertps_avx(ZEXT416((uint)*pfVar32),
                                                 ZEXT416((uint)pfVar32[lVar58]),0x10);
                        auVar117 = vinsertps_avx(auVar117,ZEXT416((uint)pfVar32[iVar22 * 2]),0x20);
                        auVar117 = vinsertps_avx(auVar117,ZEXT416((uint)pfVar32[iVar22 * 3]),0x30);
                        auVar149 = vinsertps_avx(ZEXT416((uint)pfVar32[iVar22 * 4]),
                                                 ZEXT416((uint)pfVar32[iVar22 * 5]),0x10);
                        auVar149 = vinsertps_avx(auVar149,ZEXT416((uint)pfVar32[iVar22 * 6]),0x20);
                        auVar149 = vinsertps_avx(auVar149,ZEXT416((uint)pfVar32[iVar22 * 7]),0x30);
                        fVar181 = auVar117._0_4_ * *pfVar33;
                        fVar182 = auVar117._4_4_ * pfVar33[1];
                        fVar183 = auVar117._8_4_ * pfVar33[2];
                        fVar184 = auVar117._12_4_ * pfVar33[3];
                        fVar185 = auVar149._0_4_ * pfVar33[4];
                        fVar186 = auVar149._4_4_ * pfVar33[5];
                        fVar147 = auVar149._8_4_ * pfVar33[6];
                        in_ZMM4 = ZEXT2864(CONCAT424(fVar147,CONCAT420(fVar186,CONCAT416(fVar185,
                                                  CONCAT412(fVar184,CONCAT48(fVar183,CONCAT44(
                                                  fVar182,fVar181)))))));
                        fVar81 = fVar181 + fVar81;
                        fVar82 = fVar182 + fVar82;
                        fVar83 = fVar183 + fVar83;
                        fVar84 = fVar184 + fVar84;
                        fVar85 = fVar185 + fVar85;
                        fVar86 = fVar186 + fVar86;
                        fVar179 = fVar147 + fVar179;
                        fVar180 = fVar180 + 0.0;
                        fVar171 = auVar117._0_4_ * pfVar33[8] + fVar171;
                        fVar172 = auVar117._4_4_ * pfVar33[9] + fVar172;
                        fVar173 = auVar117._8_4_ * pfVar33[10] + fVar173;
                        fVar174 = auVar117._12_4_ * pfVar33[0xb] + fVar174;
                        fVar175 = auVar149._0_4_ * pfVar33[0xc] + fVar175;
                        fVar176 = auVar149._4_4_ * pfVar33[0xd] + fVar176;
                        fVar65 = auVar149._8_4_ * pfVar33[0xe] + fVar65;
                        fVar80 = auVar149._12_4_ + fVar80;
                        pfVar33 = pfVar33 + 0x10;
                        pfVar32 = pfVar32 + lVar26;
                        iVar41 = iVar41 + -1;
                      } while (iVar41 != 0);
                    }
                  }
LAB_0053e367:
                  iVar41 = iVar42 + 0xf;
                  iVar42 = iVar42 + 8;
                  uVar35 = local_f0;
                } while (iVar41 < (int)uVar49);
              }
              auVar117 = ZEXT816(0) << 0x40;
              auVar148 = ZEXT1664(auVar117);
              if ((int)(uVar35 | 3) < (int)uVar49) {
                auVar165 = ZEXT1664((undefined1  [16])0x0);
                uVar23 = uVar35;
                do {
                  lVar29 = ((int)uVar23 / iVar4) * lVar28;
                  if (iVar4 == 4) {
                    if (0 < iVar5) {
                      pfVar32 = (float *)((long)(_func_int ***)pvVar11 + lVar29 + (long)iVar44 * 4);
                      iVar42 = iVar5;
                      do {
                        auVar148 = ZEXT1664(CONCAT412(pfVar32[3] * pfVar33[3] + auVar148._12_4_,
                                                      CONCAT48(pfVar32[2] * pfVar33[2] +
                                                               auVar148._8_4_,
                                                               CONCAT44(pfVar32[1] * pfVar33[1] +
                                                                        auVar148._4_4_,
                                                                        *pfVar32 * *pfVar33 +
                                                                        auVar148._0_4_))));
                        auVar165 = ZEXT1664(CONCAT412(pfVar32[3] * pfVar33[7] + auVar165._12_4_,
                                                      CONCAT48(pfVar32[2] * pfVar33[6] +
                                                               auVar165._8_4_,
                                                               CONCAT44(pfVar32[1] * pfVar33[5] +
                                                                        auVar165._4_4_,
                                                                        *pfVar32 * pfVar33[4] +
                                                                        auVar165._0_4_))));
                        pfVar33 = pfVar33 + 8;
                        pfVar32 = pfVar32 + iVar6 * 4;
                        iVar42 = iVar42 + -1;
                      } while (iVar42 != 0);
                      goto LAB_0053e41e;
                    }
                  }
                  else {
                    pfVar32 = (float *)((long)(_func_int ***)pvVar11 +
                                       lVar29 + (long)(iVar25 * (int)local_1f0) * 4);
LAB_0053e41e:
                    iVar42 = iVar5;
                    if (0 < iVar5 && bVar59) {
                      do {
                        auVar117 = vinsertps_avx(ZEXT416((uint)*pfVar32),
                                                 ZEXT416((uint)pfVar32[lVar58]),0x10);
                        auVar117 = vinsertps_avx(auVar117,ZEXT416((uint)pfVar32[iVar22 * 2]),0x20);
                        auVar117 = vinsertps_avx(auVar117,ZEXT416((uint)pfVar32[iVar22 * 3]),0x30);
                        auVar148 = ZEXT1664(CONCAT412(auVar117._12_4_ * pfVar33[3] + auVar148._12_4_
                                                      ,CONCAT48(auVar117._8_4_ * pfVar33[2] +
                                                                auVar148._8_4_,
                                                                CONCAT44(auVar117._4_4_ * pfVar33[1]
                                                                         + auVar148._4_4_,
                                                                         auVar117._0_4_ * *pfVar33 +
                                                                         auVar148._0_4_))));
                        auVar165 = ZEXT1664(CONCAT412(auVar117._12_4_ * pfVar33[7] + auVar165._12_4_
                                                      ,CONCAT48(auVar117._8_4_ * pfVar33[6] +
                                                                auVar165._8_4_,
                                                                CONCAT44(auVar117._4_4_ * pfVar33[5]
                                                                         + auVar165._4_4_,
                                                                         auVar117._0_4_ * pfVar33[4]
                                                                         + auVar165._0_4_))));
                        pfVar33 = pfVar33 + 8;
                        pfVar32 = pfVar32 + lVar26;
                        iVar42 = iVar42 + -1;
                      } while (iVar42 != 0);
                    }
                  }
                  auVar149 = auVar165._0_16_;
                  auVar117 = auVar148._0_16_;
                  uVar35 = uVar23 + 4;
                  iVar42 = uVar23 + 7;
                  uVar23 = uVar35;
                } while (iVar42 < (int)uVar49);
              }
              else {
                auVar149 = (undefined1  [16])0x0;
              }
              uVar31 = (ulong)uVar35;
              auVar98._0_4_ = fVar85 + fVar81;
              auVar98._4_4_ = fVar86 + fVar82;
              auVar98._8_4_ = fVar179 + fVar83;
              auVar98._12_4_ = fVar180 + fVar84;
              auVar116 = vshufpd_avx(auVar98,auVar98,1);
              auVar99._0_4_ = auVar116._0_4_ + auVar98._0_4_;
              auVar99._4_4_ = auVar116._4_4_ + auVar98._4_4_;
              auVar99._8_4_ = auVar116._8_4_ + auVar98._8_4_;
              auVar99._12_4_ = auVar116._12_4_ + auVar98._12_4_;
              auVar69._0_4_ = fVar175 + fVar171;
              auVar69._4_4_ = fVar176 + fVar172;
              auVar69._8_4_ = fVar65 + fVar173;
              auVar69._12_4_ = fVar80 + fVar174;
              auVar116 = vshufpd_avx(auVar69,auVar69,1);
              auVar70._0_4_ = auVar116._0_4_ + auVar69._0_4_;
              auVar70._4_4_ = auVar116._4_4_ + auVar69._4_4_;
              auVar70._8_4_ = auVar116._8_4_ + auVar69._8_4_;
              auVar70._12_4_ = auVar116._12_4_ + auVar69._12_4_;
              auVar116 = vshufpd_avx(auVar117,auVar117,1);
              auVar146._0_4_ = auVar116._0_4_ + auVar117._0_4_;
              auVar146._4_4_ = auVar116._4_4_ + auVar117._4_4_;
              auVar146._8_4_ = auVar116._8_4_ + auVar117._8_4_;
              auVar146._12_4_ = auVar116._12_4_ + auVar117._12_4_;
              in_ZMM4 = ZEXT1664(auVar146);
              auVar117 = vinsertps_avx(auVar70,auVar99,0x4c);
              auVar116 = vshufpd_avx(auVar149,auVar149,1);
              auVar128._0_4_ = auVar116._0_4_ + auVar149._0_4_;
              auVar128._4_4_ = auVar116._4_4_ + auVar149._4_4_;
              auVar128._8_4_ = auVar116._8_4_ + auVar149._8_4_;
              auVar128._12_4_ = auVar116._12_4_ + auVar149._12_4_;
              auVar149 = vinsertps_avx(auVar99,auVar70,0x1c);
              auVar116 = vinsertps_avx(auVar128,auVar146,0x4c);
              auVar118 = vinsertps_avx(auVar146,auVar128,0x1c);
              auVar148 = ZEXT1664(CONCAT412(auVar117._12_4_ + 0.0 +
                                            auVar149._12_4_ + auVar116._12_4_ + auVar118._12_4_,
                                            CONCAT48(auVar117._8_4_ + 0.0 +
                                                     auVar149._8_4_ + auVar116._8_4_ +
                                                     auVar118._8_4_,
                                                     CONCAT44(auVar117._4_4_ + fVar170 +
                                                              auVar149._4_4_ + auVar116._4_4_ +
                                                              auVar118._4_4_,
                                                              auVar117._0_4_ + fVar168 +
                                                              auVar149._0_4_ + auVar116._0_4_ +
                                                              auVar118._0_4_))));
              if ((int)(uVar35 | 1) < (int)uVar49) {
                lVar29 = local_148 + lVar28 * uVar31;
                ppp_Var38 = (_func_int ***)((long)&local_1d0->_vptr_Allocator + lVar28 * uVar31);
                do {
                  if (0 < iVar5) {
                    lVar36 = 0;
                    iVar42 = iVar5;
                    do {
                      fVar168 = *(float *)((long)ppp_Var38 + lVar36);
                      fVar170 = *(float *)(lVar29 + lVar36);
                      auVar148 = ZEXT1664(CONCAT412(fVar168 * 0.0 + auVar148._12_4_ + fVar170 * 0.0,
                                                    CONCAT48(fVar168 * 0.0 + auVar148._8_4_ +
                                                             fVar170 * 0.0,
                                                             CONCAT44((float)((ulong)*(undefined8 *)
                                                                                      pfVar33 >>
                                                                             0x20) * fVar168 +
                                                                      auVar148._4_4_ +
                                                                      (float)((ulong)*(undefined8 *)
                                                                                      (pfVar33 + 2)
                                                                             >> 0x20) * fVar170,
                                                                      (float)*(undefined8 *)pfVar33
                                                                      * fVar168 + auVar148._0_4_ +
                                                                      (float)*(undefined8 *)
                                                                              (pfVar33 + 2) *
                                                                      fVar170))));
                      pfVar33 = pfVar33 + 4;
                      lVar36 = lVar36 + lVar26 * 4;
                      iVar42 = iVar42 + -1;
                    } while (iVar42 != 0);
                  }
                  uVar31 = uVar31 + 2;
                  uVar35 = (uint)uVar31;
                  lVar29 = lVar29 + lVar28 * 2;
                  ppp_Var38 = (_func_int ***)((long)ppp_Var38 + lVar28 * 2);
                } while ((int)(uVar35 | 1) < (int)uVar49);
              }
              auVar117 = auVar148._0_16_;
              if ((int)uVar35 < (int)uVar49) {
                uVar31 = (ulong)uVar35;
                ppp_Var38 = (_func_int ***)((long)&local_1d0->_vptr_Allocator + lVar28 * uVar31);
                do {
                  ppp_Var46 = ppp_Var38;
                  iVar42 = iVar5;
                  if (0 < iVar5) {
                    do {
                      fVar168 = *(float *)ppp_Var46;
                      auVar148 = ZEXT1664(CONCAT412(fVar168 * 0.0 + auVar148._12_4_,
                                                    CONCAT48(fVar168 * 0.0 + auVar148._8_4_,
                                                             CONCAT44((float)((ulong)*(undefined8 *)
                                                                                      pfVar33 >>
                                                                             0x20) * fVar168 +
                                                                      auVar148._4_4_,
                                                                      (float)*(undefined8 *)pfVar33
                                                                      * fVar168 + auVar148._0_4_))))
                      ;
                      pfVar33 = pfVar33 + 2;
                      ppp_Var46 = (_func_int ***)((long)ppp_Var46 + lVar26 * 4);
                      iVar42 = iVar42 + -1;
                    } while (iVar42 != 0);
                  }
                  auVar117 = auVar148._0_16_;
                  uVar31 = uVar31 + 1;
                  ppp_Var38 = (_func_int ***)((long)ppp_Var38 + lVar28);
                } while ((int)uVar31 < (int)uVar49);
              }
              fVar168 = auVar117._0_4_;
              auVar151 = auVar117;
              switch((int)local_78) {
              case 1:
                auVar151 = vmaxps_avx(auVar117,_DAT_005a40d0);
                break;
              case 2:
                auVar149 = vcmpps_avx(ZEXT816(0) << 0x40,auVar117,1);
                fVar170 = *pfVar48;
                auVar73._4_4_ = fVar170;
                auVar73._0_4_ = fVar170;
                auVar73._8_4_ = fVar170;
                auVar73._12_4_ = fVar170;
                auVar101._8_4_ = 0x3f800000;
                auVar101._0_8_ = 0x3f8000003f800000;
                auVar101._12_4_ = 0x3f800000;
                auVar149 = vblendvps_avx(auVar73,auVar101,auVar149);
                goto LAB_0053e746;
              case 3:
                auVar61._8_8_ = 0;
                auVar61._0_8_ = *(ulong *)pfVar48;
                auVar149 = vmaxss_avx(auVar61,auVar117);
                auVar116 = vinsertps_avx(auVar61,auVar149,0x10);
                auVar149 = vinsertps_avx(auVar61,auVar117,0x4c);
                auVar149 = vcmpps_avx(auVar149,auVar116,1);
                auVar117 = vinsertps_avx(auVar116,auVar117,0x4c);
                auVar117 = vblendvps_avx(auVar117,auVar61,auVar149);
                auVar151 = vshufps_avx(auVar117,auVar117,0xe1);
                auVar117 = vcmpps_avx(auVar61,auVar151,1);
                if ((auVar117 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  auVar151 = vinsertps_avx(auVar151,auVar61,0x50);
                }
                break;
              case 4:
                auVar100._8_4_ = 0x42b0c0a5;
                auVar100._0_8_ = 0x42b0c0a542b0c0a5;
                auVar100._12_4_ = 0x42b0c0a5;
                auVar149 = vminps_avx(auVar117,auVar100);
                auVar71._8_4_ = 0xc2b0c0a5;
                auVar71._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar71._12_4_ = 0xc2b0c0a5;
                auVar117 = vcmpps_avx(auVar149,auVar71,1);
                auVar62._0_8_ = auVar149._0_8_ ^ 0x8000000080000000;
                auVar62._8_4_ = auVar149._8_4_ ^ 0x80000000;
                auVar62._12_4_ = auVar149._12_4_ ^ 0x80000000;
                auVar117 = vblendvps_avx(auVar62,auVar100,auVar117);
                in_ZMM4 = ZEXT1664(auVar146);
                local_198._0_4_ = expf(auVar117._0_4_);
                local_198._4_4_ = extraout_XMM0_Db_00;
                local_198._8_4_ = extraout_XMM0_Dc_00;
                local_198._12_4_ = extraout_XMM0_Dd_00;
                auVar117 = vmovshdup_avx(auVar117);
                auVar153._0_4_ = expf(auVar117._0_4_);
                auVar153._4_60_ = extraout_var_00;
                auVar117 = vinsertps_avx(local_198,auVar153._0_16_,0x10);
                auVar72._8_4_ = 0x3f800000;
                auVar72._0_8_ = 0x3f8000003f800000;
                auVar72._12_4_ = 0x3f800000;
                auVar63._0_4_ = auVar117._0_4_ + 1.0;
                auVar63._4_4_ = auVar117._4_4_ + 1.0;
                auVar63._8_4_ = auVar117._8_4_ + 1.0;
                auVar63._12_4_ = auVar117._12_4_ + 1.0;
                auVar151 = vdivps_avx(auVar72,auVar63);
                break;
              case 5:
                in_ZMM4 = ZEXT1664(auVar146);
                fVar170 = expf(fVar168);
                fVar170 = logf(fVar170 + 1.0);
                local_108._0_4_ = tanhf(fVar170);
                local_108._4_4_ = extraout_XMM0_Db;
                local_108._8_4_ = extraout_XMM0_Dc;
                local_108._12_4_ = extraout_XMM0_Dd;
                auVar149 = vmovshdup_avx(auVar117);
                fVar170 = expf(auVar149._0_4_);
                fVar170 = logf(fVar170 + 1.0);
                auVar167._0_4_ = tanhf(fVar170);
                auVar167._4_60_ = extraout_var;
                auVar149 = vinsertps_avx(local_108,auVar167._0_16_,0x10);
LAB_0053e746:
                auVar151._0_4_ = auVar149._0_4_ * fVar168;
                auVar151._4_4_ = auVar149._4_4_ * auVar117._4_4_;
                auVar151._8_4_ = auVar149._8_4_ * auVar117._8_4_;
                auVar151._12_4_ = auVar149._12_4_ * auVar117._12_4_;
                break;
              case 6:
                fVar170 = *pfVar48;
                fVar171 = pfVar48[1];
                fVar172 = -fVar171 / fVar170;
                auVar149 = SUB6416(ZEXT464(0),0) << 0x20;
                if ((fVar172 <= fVar168) &&
                   (auVar149 = auVar117, fVar168 <= fVar172 + 1.0 / fVar170)) {
                  auVar149 = ZEXT416((uint)((fVar170 * fVar168 + fVar171) * fVar168));
                }
                auVar116 = vmovshdup_avx(auVar117);
                in_ZMM4 = ZEXT1664(auVar116);
                fVar168 = auVar116._0_4_;
                if (fVar172 <= fVar168) {
                  auVar151._4_12_ = auVar117._4_12_;
                  auVar151._0_4_ = (float)auVar149._0_4_;
                  if (fVar168 <= fVar172 + 1.0 / fVar170) {
                    auVar151 = vinsertps_avx(auVar151,ZEXT416((uint)((fVar170 * fVar168 + fVar171) *
                                                                    fVar168)),0x10);
                  }
                }
                else {
                  auVar151 = vblendps_avx(auVar149,_DAT_005a40d0,0xe);
                }
              }
              *puVar56 = auVar151._0_4_;
              uVar7 = vextractps_avx(auVar151,1);
              *puVar54 = uVar7;
              puVar56 = puVar56 + 1;
              puVar54 = puVar54 + 1;
              local_1f0 = local_1f0 + 1;
              iVar44 = iVar44 + iVar55;
              local_148 = local_148 + lVar27 * 4;
              local_1d0 = (Allocator *)((long)&local_1d0->_vptr_Allocator + lVar27 * 4);
            } while (local_1f0 != uVar39);
          }
          local_170 = local_170 + 1;
        } while (local_170 != uVar30);
      }
      iVar25 = (int)local_60 + (int)local_68 * 2;
      if (iVar25 < (int)local_80) {
        pvVar11 = top_blob->data;
        iVar55 = top_blob->w;
        sVar9 = top_blob->elemsize;
        sVar10 = (this->weight_data_tm).elemsize;
        sVar12 = (this->weight_data_tm).cstep;
        bVar59 = 0 < iVar5;
        local_188 = uVar21 & 0xfffffff8;
        local_1b8 = (ulong)iVar25;
        pvVar13 = (this->weight_data_tm).data;
        do {
          pvVar19 = local_c8.data;
          if (0 < (int)local_58) {
            pfVar48 = (float *)((long)iVar55 * sVar9 * local_1b8 + (long)pvVar11);
            iVar25 = (int)local_1b8;
            iVar44 = iVar25 + 7;
            if (-1 < iVar25) {
              iVar44 = iVar25;
            }
            iVar42 = iVar25 + 3;
            if (-1 < iVar25) {
              iVar42 = iVar25;
            }
            cVar20 = (char)local_1b8 - ((byte)iVar44 & 0xf8);
            pfVar33 = (float *)((long)(int)((iVar25 - (((uint)(local_1b8 >> 0x1f) & 1) + iVar25 &
                                                      0xfffffffe)) + (iVar44 >> 3) +
                                            (int)((char)((char)local_1b8 - ((byte)iVar42 & 0xfc)) /
                                                 '\x02') +
                                           (int)((char)(((byte)(cVar20 >> 7) >> 6) + cVar20) >> 2))
                                * sVar10 * sVar12 + (long)pvVar13);
            lVar53 = (long)local_c8.w * local_c8.elemsize;
            pfVar52 = (float *)(this->super_Convolution1D).activation_params.data;
            local_1d8 = (void *)((long)(_func_int ***)local_c8.data + lVar58 * 4);
            iVar25 = 0;
            local_1d0 = (Allocator *)local_c8.data;
            local_1f0 = 0;
            do {
              if (pvVar8 == (void *)0x0) {
                fVar168 = 0.0;
              }
              else {
                fVar168 = *(float *)((long)pvVar8 + local_1b8 * 4);
              }
              pfVar32 = pfVar33;
              if ((int)uVar21 < 8) {
                fVar170 = 0.0;
                fVar171 = 0.0;
                fVar172 = 0.0;
                fVar173 = 0.0;
                fVar174 = 0.0;
                fVar175 = 0.0;
                fVar176 = 0.0;
                fVar65 = 0.0;
                uVar35 = 0;
              }
              else {
                fVar170 = 0.0;
                fVar171 = 0.0;
                fVar172 = 0.0;
                fVar173 = 0.0;
                fVar174 = 0.0;
                fVar175 = 0.0;
                fVar176 = 0.0;
                fVar65 = 0.0;
                iVar44 = 0;
                do {
                  lVar28 = (iVar44 / iVar4) * lVar53;
                  if (iVar4 == 8 && bVar59) {
                    pfVar34 = (float *)((long)(_func_int ***)pvVar19 + lVar28 + (long)iVar25 * 4);
                    iVar42 = iVar5;
                    do {
                      fVar170 = *pfVar32 * *pfVar34 + fVar170;
                      fVar171 = pfVar32[1] * pfVar34[1] + fVar171;
                      fVar172 = pfVar32[2] * pfVar34[2] + fVar172;
                      fVar173 = pfVar32[3] * pfVar34[3] + fVar173;
                      fVar174 = pfVar32[4] * pfVar34[4] + fVar174;
                      fVar175 = pfVar32[5] * pfVar34[5] + fVar175;
                      fVar176 = pfVar32[6] * pfVar34[6] + fVar176;
                      fVar65 = pfVar32[7] + fVar65;
                      pfVar32 = pfVar32 + 8;
                      pfVar34 = pfVar34 + iVar6 * 8;
                      iVar42 = iVar42 + -1;
                    } while (iVar42 != 0);
                  }
                  else {
                    pfVar34 = (float *)((long)(_func_int ***)pvVar19 +
                                       lVar28 + (long)(iVar4 * iVar47 * (int)local_1f0) * 4);
                  }
                  if (iVar4 == 4) {
                    iVar42 = iVar5;
                    if (0 < iVar5) {
                      do {
                        fVar170 = *pfVar34 * *pfVar32 + fVar170;
                        fVar171 = pfVar34[1] * pfVar32[1] + fVar171;
                        fVar172 = pfVar34[2] * pfVar32[2] + fVar172;
                        fVar173 = pfVar34[3] * pfVar32[3] + fVar173;
                        fVar174 = pfVar34[lVar58 + 4] * pfVar32[4] + fVar174;
                        fVar175 = pfVar34[lVar58 + 5] * pfVar32[5] + fVar175;
                        fVar176 = pfVar34[lVar58 + 6] * pfVar32[6] + fVar176;
                        fVar65 = pfVar34[lVar58 + 7] + fVar65;
                        pfVar32 = pfVar32 + 8;
                        pfVar34 = pfVar34 + iVar6 * 4;
                        iVar42 = iVar42 + -1;
                      } while (iVar42 != 0);
                      goto LAB_0053ebeb;
                    }
                  }
                  else {
LAB_0053ebeb:
                    iVar42 = iVar5;
                    if (iVar4 == 1 && bVar59) {
                      do {
                        auVar117 = vinsertps_avx(ZEXT416((uint)*pfVar34),
                                                 ZEXT416((uint)pfVar34[lVar58]),0x10);
                        auVar117 = vinsertps_avx(auVar117,ZEXT416((uint)pfVar34[iVar22 * 2]),0x20);
                        auVar117 = vinsertps_avx(auVar117,ZEXT416((uint)pfVar34[iVar22 * 3]),0x30);
                        auVar149 = vinsertps_avx(ZEXT416((uint)pfVar34[iVar22 * 4]),
                                                 ZEXT416((uint)pfVar34[iVar22 * 5]),0x10);
                        auVar149 = vinsertps_avx(auVar149,ZEXT416((uint)pfVar34[iVar22 * 6]),0x20);
                        auVar149 = vinsertps_avx(auVar149,ZEXT416((uint)pfVar34[iVar22 * 7]),0x30);
                        fVar170 = auVar117._0_4_ * *pfVar32 + fVar170;
                        fVar171 = auVar117._4_4_ * pfVar32[1] + fVar171;
                        fVar172 = auVar117._8_4_ * pfVar32[2] + fVar172;
                        fVar173 = auVar117._12_4_ * pfVar32[3] + fVar173;
                        fVar174 = auVar149._0_4_ * pfVar32[4] + fVar174;
                        fVar175 = auVar149._4_4_ * pfVar32[5] + fVar175;
                        fVar176 = auVar149._8_4_ * pfVar32[6] + fVar176;
                        fVar65 = auVar149._12_4_ + fVar65;
                        pfVar32 = pfVar32 + 8;
                        pfVar34 = pfVar34 + lVar26;
                        iVar42 = iVar42 + -1;
                      } while (iVar42 != 0);
                    }
                  }
                  iVar42 = iVar44 + 0xf;
                  iVar44 = iVar44 + 8;
                  uVar35 = local_188;
                } while (iVar42 < (int)uVar21);
              }
              auVar117 = ZEXT816(0) << 0x40;
              auVar148 = ZEXT1664(auVar117);
              if ((int)(uVar35 | 3) < (int)uVar21) {
                uVar39 = uVar35;
                do {
                  lVar28 = ((int)uVar39 / iVar4) * lVar53;
                  if (iVar4 == 4 && bVar59) {
                    pfVar34 = (float *)((long)(_func_int ***)pvVar19 + lVar28 + (long)iVar25 * 4);
                    iVar44 = iVar5;
                    do {
                      auVar148 = ZEXT1664(CONCAT412(pfVar32[3] * pfVar34[3] + auVar148._12_4_,
                                                    CONCAT48(pfVar32[2] * pfVar34[2] +
                                                             auVar148._8_4_,
                                                             CONCAT44(pfVar32[1] * pfVar34[1] +
                                                                      auVar148._4_4_,
                                                                      *pfVar32 * *pfVar34 +
                                                                      auVar148._0_4_))));
                      pfVar32 = pfVar32 + 4;
                      pfVar34 = pfVar34 + iVar6 * 4;
                      iVar44 = iVar44 + -1;
                    } while (iVar44 != 0);
                  }
                  else {
                    pfVar34 = (float *)((long)(_func_int ***)pvVar19 +
                                       lVar28 + (long)(iVar4 * iVar47 * (int)local_1f0) * 4);
                  }
                  iVar44 = iVar5;
                  if (iVar4 == 1 && bVar59) {
                    do {
                      auVar117 = vinsertps_avx(ZEXT416((uint)*pfVar34),
                                               ZEXT416((uint)pfVar34[lVar58]),0x10);
                      auVar117 = vinsertps_avx(auVar117,ZEXT416((uint)pfVar34[iVar22 * 2]),0x20);
                      auVar117 = vinsertps_avx(auVar117,ZEXT416((uint)pfVar34[iVar22 * 3]),0x30);
                      auVar148 = ZEXT1664(CONCAT412(auVar117._12_4_ * pfVar32[3] + auVar148._12_4_,
                                                    CONCAT48(auVar117._8_4_ * pfVar32[2] +
                                                             auVar148._8_4_,
                                                             CONCAT44(auVar117._4_4_ * pfVar32[1] +
                                                                      auVar148._4_4_,
                                                                      auVar117._0_4_ * *pfVar32 +
                                                                      auVar148._0_4_))));
                      pfVar32 = pfVar32 + 4;
                      pfVar34 = pfVar34 + lVar26;
                      iVar44 = iVar44 + -1;
                    } while (iVar44 != 0);
                  }
                  auVar117 = auVar148._0_16_;
                  uVar35 = uVar39 + 4;
                  iVar44 = uVar39 + 7;
                  uVar39 = uVar35;
                } while (iVar44 < (int)uVar21);
              }
              uVar30 = (ulong)uVar35;
              auVar74._0_4_ = fVar174 + fVar170;
              auVar74._4_4_ = fVar175 + fVar171;
              auVar74._8_4_ = fVar176 + fVar172;
              auVar74._12_4_ = fVar65 + fVar173;
              auVar149 = vshufpd_avx(auVar74,auVar74,1);
              auVar75._0_4_ = auVar149._0_4_ + auVar74._0_4_;
              auVar75._4_4_ = auVar149._4_4_ + auVar74._4_4_;
              auVar75._8_4_ = auVar149._8_4_ + auVar74._8_4_;
              auVar75._12_4_ = auVar149._12_4_ + auVar74._12_4_;
              auVar149 = vmovshdup_avx(auVar75);
              auVar116 = vshufpd_avx(auVar117,auVar117,1);
              auVar102._0_4_ = auVar116._0_4_ + auVar117._0_4_;
              auVar102._4_4_ = auVar116._4_4_ + auVar117._4_4_;
              auVar102._8_4_ = auVar116._8_4_ + auVar117._8_4_;
              auVar102._12_4_ = auVar116._12_4_ + auVar117._12_4_;
              auVar117 = vmovshdup_avx(auVar102);
              auVar148 = ZEXT464((uint)(auVar149._0_4_ + fVar168 +
                                       auVar75._0_4_ + auVar117._0_4_ + auVar102._0_4_));
              if ((int)(uVar35 | 1) < (int)uVar21) {
                pvVar45 = (void *)((long)local_1d8 + lVar53 * uVar30);
                ppp_Var38 = (_func_int ***)((long)&local_1d0->_vptr_Allocator + lVar53 * uVar30);
                do {
                  if (0 < iVar5) {
                    lVar28 = 0;
                    iVar44 = iVar5;
                    do {
                      auVar148 = ZEXT464((uint)(*pfVar32 * *(float *)((long)ppp_Var38 + lVar28) +
                                                auVar148._0_4_ +
                                               pfVar32[1] * *(float *)((long)pvVar45 + lVar28)));
                      pfVar32 = pfVar32 + 2;
                      lVar28 = lVar28 + lVar26 * 4;
                      iVar44 = iVar44 + -1;
                    } while (iVar44 != 0);
                  }
                  uVar30 = uVar30 + 2;
                  uVar35 = (uint)uVar30;
                  pvVar45 = (void *)((long)pvVar45 + lVar53 * 2);
                  ppp_Var38 = (_func_int ***)((long)ppp_Var38 + lVar53 * 2);
                } while ((int)(uVar35 | 1) < (int)uVar21);
              }
              auVar117 = auVar148._0_16_;
              if ((int)uVar35 < (int)uVar21) {
                uVar30 = (ulong)uVar35;
                ppp_Var38 = (_func_int ***)((long)&local_1d0->_vptr_Allocator + lVar53 * uVar30);
                do {
                  ppp_Var46 = ppp_Var38;
                  iVar44 = iVar5;
                  if (0 < iVar5) {
                    do {
                      auVar148 = ZEXT464((uint)(*pfVar32 * *(float *)ppp_Var46 + auVar148._0_4_));
                      pfVar32 = pfVar32 + 1;
                      ppp_Var46 = (_func_int ***)((long)ppp_Var46 + lVar26 * 4);
                      iVar44 = iVar44 + -1;
                    } while (iVar44 != 0);
                  }
                  auVar117 = auVar148._0_16_;
                  uVar30 = uVar30 + 1;
                  ppp_Var38 = (_func_int ***)((long)ppp_Var38 + lVar53);
                } while ((int)uVar30 < (int)uVar21);
              }
              fVar170 = auVar117._0_4_;
              fVar168 = fVar170;
              switch((int)local_78) {
              case 1:
                auVar117 = vmaxss_avx(auVar117,ZEXT416(0));
                fVar168 = auVar117._0_4_;
                break;
              case 2:
                auVar117 = vcmpss_avx(ZEXT416(0) << 0x20,auVar117,1);
                auVar104._8_4_ = 0x3f800000;
                auVar104._0_8_ = 0x3f8000003f800000;
                auVar104._12_4_ = 0x3f800000;
                auVar117 = vblendvps_avx(ZEXT416((uint)*pfVar52),auVar104,auVar117);
                fVar168 = auVar117._0_4_ * fVar170;
                break;
              case 3:
                auVar117 = vmaxss_avx(auVar117,ZEXT416((uint)*pfVar52));
                fVar168 = auVar117._0_4_;
                if (pfVar52[1] < auVar117._0_4_) {
                  fVar168 = pfVar52[1];
                }
                break;
              case 4:
                auVar117 = vminss_avx(auVar117,ZEXT416(0x42b0c0a5));
                auVar76._0_8_ = auVar117._0_8_ ^ 0x8000000080000000;
                auVar76._8_4_ = auVar117._8_4_ ^ 0x80000000;
                auVar76._12_4_ = auVar117._12_4_ ^ 0x80000000;
                auVar117 = vcmpss_avx(auVar117,ZEXT416(0xc2b0c0a5),1);
                auVar103._8_4_ = 0x42b0c0a5;
                auVar103._0_8_ = 0x42b0c0a542b0c0a5;
                auVar103._12_4_ = 0x42b0c0a5;
                auVar117 = vblendvps_avx(auVar76,auVar103,auVar117);
                fVar168 = expf(auVar117._0_4_);
                fVar168 = 1.0 / (fVar168 + 1.0);
                break;
              case 5:
                fVar168 = expf(fVar170);
                fVar168 = logf(fVar168 + 1.0);
                fVar168 = tanhf(fVar168);
                fVar168 = fVar168 * fVar170;
                break;
              case 6:
                fVar171 = *pfVar52;
                fVar172 = -pfVar52[1] / fVar171;
                fVar168 = 0.0;
                if ((fVar172 <= fVar170) && (fVar168 = fVar170, fVar170 <= fVar172 + 1.0 / fVar171))
                {
                  fVar168 = (fVar171 * fVar170 + pfVar52[1]) * fVar170;
                }
              }
              *pfVar48 = fVar168;
              pfVar48 = pfVar48 + 1;
              local_1f0 = local_1f0 + 1;
              iVar25 = iVar25 + iVar47 * iVar4;
              local_1d8 = (void *)((long)local_1d8 + lVar27 * 4);
              local_1d0 = (Allocator *)((long)&local_1d0->_vptr_Allocator + lVar27 * 4);
            } while (local_1f0 != local_58);
          }
          local_1b8 = local_1b8 + 1;
        } while (local_1b8 != local_80);
      }
      iVar47 = 0;
    }
  }
  piVar17 = (int *)CONCAT44(local_c8.refcount._4_4_,(int)local_c8.refcount);
  if (piVar17 != (int *)0x0) {
    LOCK();
    *piVar17 = *piVar17 + -1;
    UNLOCK();
    if (*piVar17 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_c8.data != (Allocator *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar47;
}

Assistant:

int Convolution1D_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = num_output / out_elempack;

    top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    convolution1d_packed(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, kernel_w, dilation_w, stride_w, activation_type, activation_params, opt);

    return 0;
}